

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx2::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx2::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx2::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  undefined8 uVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Primitive PVar16;
  int iVar17;
  __int_type_conflict _Var18;
  RTCFilterFunctionN p_Var19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  uint uVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [28];
  undefined1 auVar97 [28];
  uint uVar98;
  uint uVar99;
  ulong uVar100;
  uint uVar101;
  long lVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  Geometry *pGVar106;
  undefined4 uVar107;
  undefined8 unaff_R13;
  ulong uVar108;
  undefined8 uVar109;
  undefined1 auVar110 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar111 [16];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar125 [16];
  undefined8 uVar124;
  float fVar142;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar141;
  float fVar143;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [64];
  undefined1 auVar148 [16];
  float fVar147;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar149 [16];
  undefined1 auVar161 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  undefined1 auVar170 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [16];
  undefined1 auVar196 [32];
  undefined1 auVar195 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  float fVar200;
  float fVar205;
  float fVar207;
  float fVar209;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar206;
  float fVar208;
  float fVar210;
  undefined1 auVar204 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  float fVar219;
  undefined1 auVar220 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [32];
  undefined4 uVar223;
  float fVar224;
  float fVar231;
  undefined1 auVar225 [16];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 in_ZMM13 [64];
  undefined1 auVar232 [64];
  undefined1 auVar233 [64];
  undefined8 uVar235;
  undefined8 uVar236;
  undefined1 auVar234 [32];
  undefined8 uVar237;
  undefined1 auVar238 [32];
  undefined1 in_ZMM15 [64];
  undefined1 auVar239 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_7f4;
  RayHit *local_7f0;
  ulong local_7e8;
  undefined1 local_7e0 [32];
  long local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  Primitive *local_720;
  Precalculations *local_718;
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_650;
  undefined4 local_648;
  float local_644;
  undefined4 local_640;
  undefined4 local_63c;
  undefined4 local_638;
  uint local_634;
  uint local_630;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [2] [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  undefined1 auStack_450 [16];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  int local_280;
  int local_27c;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_200 [4];
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [8];
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined4 local_120;
  undefined4 uStack_11c;
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar16 = prim[1];
  uVar100 = (ulong)(byte)PVar16;
  auVar173._8_8_ = 0;
  auVar173._0_8_ = *(ulong *)(prim + uVar100 * 4 + 6);
  auVar120 = vpmovsxbd_avx2(auVar173);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar100 * 5 + 6);
  auVar198 = vpmovsxbd_avx2(auVar8);
  local_718 = pre;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar100 * 6 + 6);
  auVar20 = vpmovsxbd_avx2(auVar9);
  lVar102 = uVar100 * 0x25;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar100 * 0xf + 6);
  auVar21 = vpmovsxbd_avx2(auVar10);
  auVar126._1_3_ = 0;
  auVar126[0] = PVar16;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar16 * 0x10 + 6);
  auVar121 = vpmovsxbd_avx2(auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar100 * 0x11 + 6);
  auVar163 = vpmovsxbd_avx2(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar100 * 0x1a + 6);
  auVar160 = vpmovsxbd_avx2(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar100 * 0x1b + 6);
  auVar161 = vpmovsxbd_avx2(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar100 * 0x1c + 6);
  auVar22 = vpmovsxbd_avx2(auVar15);
  fVar147 = *(float *)(prim + lVar102 + 0x12);
  auVar173 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar102 + 6));
  fVar141 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar102 + 0x16)) *
            *(float *)(prim + lVar102 + 0x1a);
  auVar194._0_4_ = fVar147 * auVar173._0_4_;
  auVar194._4_4_ = fVar147 * auVar173._4_4_;
  auVar194._8_4_ = fVar147 * auVar173._8_4_;
  auVar194._12_4_ = fVar147 * auVar173._12_4_;
  auVar110._0_4_ = fVar147 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar110._4_4_ = fVar147 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar110._8_4_ = fVar147 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar110._12_4_ = fVar147 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar198 = vcvtdq2ps_avx(auVar198);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar163 = vcvtdq2ps_avx(auVar163);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar173 = vmovshdup_avx(auVar110);
  uVar109 = auVar173._0_8_;
  auVar201._8_8_ = uVar109;
  auVar201._0_8_ = uVar109;
  auVar201._16_8_ = uVar109;
  auVar201._24_8_ = uVar109;
  auVar173 = vshufps_avx(auVar110,auVar110,0xaa);
  fVar147 = auVar173._0_4_;
  auVar232._0_4_ = fVar147 * auVar20._0_4_;
  fVar142 = auVar173._4_4_;
  auVar232._4_4_ = fVar142 * auVar20._4_4_;
  auVar232._8_4_ = fVar147 * auVar20._8_4_;
  auVar232._12_4_ = fVar142 * auVar20._12_4_;
  auVar232._16_4_ = fVar147 * auVar20._16_4_;
  auVar232._20_4_ = fVar142 * auVar20._20_4_;
  auVar232._28_36_ = in_ZMM15._28_36_;
  auVar232._24_4_ = fVar147 * auVar20._24_4_;
  auVar229._0_4_ = fVar147 * auVar163._0_4_;
  auVar229._4_4_ = fVar142 * auVar163._4_4_;
  auVar229._8_4_ = fVar147 * auVar163._8_4_;
  auVar229._12_4_ = fVar142 * auVar163._12_4_;
  auVar229._16_4_ = fVar147 * auVar163._16_4_;
  auVar229._20_4_ = fVar142 * auVar163._20_4_;
  auVar229._28_36_ = in_ZMM13._28_36_;
  auVar229._24_4_ = fVar147 * auVar163._24_4_;
  auVar215._4_4_ = fVar142 * auVar22._4_4_;
  auVar215._0_4_ = fVar147 * auVar22._0_4_;
  auVar215._8_4_ = fVar147 * auVar22._8_4_;
  auVar215._12_4_ = fVar142 * auVar22._12_4_;
  auVar215._16_4_ = fVar147 * auVar22._16_4_;
  auVar215._20_4_ = fVar142 * auVar22._20_4_;
  auVar215._24_4_ = fVar147 * auVar22._24_4_;
  auVar215._28_4_ = fVar142;
  auVar173 = vfmadd231ps_fma(auVar232._0_32_,auVar201,auVar198);
  auVar8 = vfmadd231ps_fma(auVar229._0_32_,auVar201,auVar121);
  auVar9 = vfmadd231ps_fma(auVar215,auVar161,auVar201);
  auVar215 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 7 + 6));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar112._4_4_ = auVar110._0_4_;
  auVar112._0_4_ = auVar110._0_4_;
  auVar112._8_4_ = auVar110._0_4_;
  auVar112._12_4_ = auVar110._0_4_;
  auVar112._16_4_ = auVar110._0_4_;
  auVar112._20_4_ = auVar110._0_4_;
  auVar112._24_4_ = auVar110._0_4_;
  auVar112._28_4_ = auVar110._0_4_;
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar112,auVar120);
  auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar112,auVar21);
  auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar160,auVar112);
  auVar173 = vshufps_avx(auVar194,auVar194,0xaa);
  fVar147 = auVar173._0_4_;
  fVar142 = auVar173._4_4_;
  auVar115._4_4_ = fVar142 * auVar20._4_4_;
  auVar115._0_4_ = fVar147 * auVar20._0_4_;
  auVar115._8_4_ = fVar147 * auVar20._8_4_;
  auVar115._12_4_ = fVar142 * auVar20._12_4_;
  auVar115._16_4_ = fVar147 * auVar20._16_4_;
  auVar115._20_4_ = fVar142 * auVar20._20_4_;
  auVar115._24_4_ = fVar147 * auVar20._24_4_;
  auVar115._28_4_ = auVar20._28_4_;
  auVar113._0_4_ = fVar147 * auVar163._0_4_;
  auVar113._4_4_ = fVar142 * auVar163._4_4_;
  auVar113._8_4_ = fVar147 * auVar163._8_4_;
  auVar113._12_4_ = fVar142 * auVar163._12_4_;
  auVar113._16_4_ = fVar147 * auVar163._16_4_;
  auVar113._20_4_ = fVar142 * auVar163._20_4_;
  auVar113._24_4_ = fVar147 * auVar163._24_4_;
  auVar113._28_4_ = 0;
  auVar20._4_4_ = fVar142 * auVar22._4_4_;
  auVar20._0_4_ = fVar147 * auVar22._0_4_;
  auVar20._8_4_ = fVar147 * auVar22._8_4_;
  auVar20._12_4_ = fVar142 * auVar22._12_4_;
  auVar20._16_4_ = fVar147 * auVar22._16_4_;
  auVar20._20_4_ = fVar142 * auVar22._20_4_;
  auVar20._24_4_ = fVar147 * auVar22._24_4_;
  auVar20._28_4_ = auVar22._28_4_;
  auVar173 = vmovshdup_avx(auVar194);
  auVar158._0_8_ = auVar173._0_8_;
  auVar158._8_8_ = auVar158._0_8_;
  auVar158._16_8_ = auVar158._0_8_;
  auVar158._24_8_ = auVar158._0_8_;
  auVar173 = vfmadd231ps_fma(auVar115,auVar158,auVar198);
  auVar11 = vfmadd231ps_fma(auVar113,auVar158,auVar121);
  auVar12 = vfmadd231ps_fma(auVar20,auVar158,auVar161);
  local_1a0._8_4_ = 0x7fffffff;
  local_1a0._0_8_ = 0x7fffffff7fffffff;
  local_1a0._12_4_ = 0x7fffffff;
  local_1a0._16_4_ = 0x7fffffff;
  local_1a0._20_4_ = 0x7fffffff;
  local_1a0._24_4_ = 0x7fffffff;
  local_1a0._28_4_ = 0x7fffffff;
  auVar159._8_4_ = 0x219392ef;
  auVar159._0_8_ = 0x219392ef219392ef;
  auVar159._12_4_ = 0x219392ef;
  auVar159._16_4_ = 0x219392ef;
  auVar159._20_4_ = 0x219392ef;
  auVar159._24_4_ = 0x219392ef;
  auVar159._28_4_ = 0x219392ef;
  auVar198 = vandps_avx(ZEXT1632(auVar10),local_1a0);
  auVar198 = vcmpps_avx(auVar198,auVar159,1);
  auVar20 = vblendvps_avx(ZEXT1632(auVar10),auVar159,auVar198);
  auVar198 = vandps_avx(ZEXT1632(auVar8),local_1a0);
  auVar198 = vcmpps_avx(auVar198,auVar159,1);
  auVar121 = vblendvps_avx(ZEXT1632(auVar8),auVar159,auVar198);
  auVar198 = vandps_avx(local_1a0,ZEXT1632(auVar9));
  auVar198 = vcmpps_avx(auVar198,auVar159,1);
  auVar198 = vblendvps_avx(ZEXT1632(auVar9),auVar159,auVar198);
  auVar161 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0xb + 6));
  auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 9 + 6));
  auVar115 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0xd + 6));
  auVar196._4_4_ = auVar194._0_4_;
  auVar196._0_4_ = auVar194._0_4_;
  auVar196._8_4_ = auVar194._0_4_;
  auVar196._12_4_ = auVar194._0_4_;
  auVar196._16_4_ = auVar194._0_4_;
  auVar196._20_4_ = auVar194._0_4_;
  auVar196._24_4_ = auVar194._0_4_;
  auVar196._28_4_ = auVar194._0_4_;
  auVar110 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar196,auVar120);
  auVar120 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x12 + 6));
  auVar194 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar196,auVar21);
  auVar21 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x16 + 6));
  auVar111 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar196,auVar160);
  auVar163 = vrcpps_avx(auVar20);
  auVar238._8_4_ = 0x3f800000;
  auVar238._0_8_ = 0x3f8000003f800000;
  auVar238._12_4_ = 0x3f800000;
  auVar238._16_4_ = 0x3f800000;
  auVar238._20_4_ = 0x3f800000;
  auVar238._24_4_ = 0x3f800000;
  auVar238._28_4_ = 0x3f800000;
  auVar173 = vfnmadd213ps_fma(auVar20,auVar163,auVar238);
  auVar173 = vfmadd132ps_fma(ZEXT1632(auVar173),auVar163,auVar163);
  auVar234._4_4_ = fVar141;
  auVar234._0_4_ = fVar141;
  auVar234._8_4_ = fVar141;
  auVar234._12_4_ = fVar141;
  auVar234._16_4_ = fVar141;
  auVar234._20_4_ = fVar141;
  auVar234._24_4_ = fVar141;
  auVar234._28_4_ = fVar141;
  auVar20 = vcvtdq2ps_avx(auVar215);
  auVar163 = vcvtdq2ps_avx(auVar161);
  auVar163 = vsubps_avx(auVar163,auVar20);
  auVar10 = vfmadd213ps_fma(auVar163,auVar234,auVar20);
  auVar20 = vcvtdq2ps_avx(auVar22);
  auVar163 = vcvtdq2ps_avx(auVar115);
  auVar163 = vsubps_avx(auVar163,auVar20);
  auVar11 = vfmadd213ps_fma(auVar163,auVar234,auVar20);
  auVar20 = vcvtdq2ps_avx(auVar120);
  auVar163 = vcvtdq2ps_avx(auVar21);
  auVar163 = vsubps_avx(auVar163,auVar20);
  auVar12 = vfmadd213ps_fma(auVar163,auVar234,auVar20);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x14 + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar163 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x18 + 6));
  auVar163 = vcvtdq2ps_avx(auVar163);
  auVar163 = vsubps_avx(auVar163,auVar20);
  auVar13 = vfmadd213ps_fma(auVar163,auVar234,auVar20);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x1d + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar163 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x21 + 6));
  auVar163 = vcvtdq2ps_avx(auVar163);
  auVar163 = vsubps_avx(auVar163,auVar20);
  auVar14 = vfmadd213ps_fma(auVar163,auVar234,auVar20);
  auVar20 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x1f + 6));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar163 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar100 * 0x23 + 6));
  auVar163 = vcvtdq2ps_avx(auVar163);
  auVar163 = vsubps_avx(auVar163,auVar20);
  auVar15 = vfmadd213ps_fma(auVar163,auVar234,auVar20);
  auVar20 = vrcpps_avx(auVar121);
  auVar8 = vfnmadd213ps_fma(auVar121,auVar20,auVar238);
  auVar121 = vrcpps_avx(auVar198);
  auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar20,auVar20);
  auVar9 = vfnmadd213ps_fma(auVar198,auVar121,auVar238);
  auVar9 = vfmadd132ps_fma(ZEXT1632(auVar9),auVar121,auVar121);
  auVar198 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar110));
  auVar121._4_4_ = auVar173._4_4_ * auVar198._4_4_;
  auVar121._0_4_ = auVar173._0_4_ * auVar198._0_4_;
  auVar121._8_4_ = auVar173._8_4_ * auVar198._8_4_;
  auVar121._12_4_ = auVar173._12_4_ * auVar198._12_4_;
  auVar121._16_4_ = auVar198._16_4_ * 0.0;
  auVar121._20_4_ = auVar198._20_4_ * 0.0;
  auVar121._24_4_ = auVar198._24_4_ * 0.0;
  auVar121._28_4_ = auVar198._28_4_;
  auVar198 = vsubps_avx(ZEXT1632(auVar11),ZEXT1632(auVar110));
  auVar185._0_4_ = auVar173._0_4_ * auVar198._0_4_;
  auVar185._4_4_ = auVar173._4_4_ * auVar198._4_4_;
  auVar185._8_4_ = auVar173._8_4_ * auVar198._8_4_;
  auVar185._12_4_ = auVar173._12_4_ * auVar198._12_4_;
  auVar185._16_4_ = auVar198._16_4_ * 0.0;
  auVar185._20_4_ = auVar198._20_4_ * 0.0;
  auVar185._24_4_ = auVar198._24_4_ * 0.0;
  auVar185._28_4_ = 0;
  auVar198 = vsubps_avx(ZEXT1632(auVar12),ZEXT1632(auVar194));
  auVar163._4_4_ = auVar8._4_4_ * auVar198._4_4_;
  auVar163._0_4_ = auVar8._0_4_ * auVar198._0_4_;
  auVar163._8_4_ = auVar8._8_4_ * auVar198._8_4_;
  auVar163._12_4_ = auVar8._12_4_ * auVar198._12_4_;
  auVar163._16_4_ = auVar198._16_4_ * 0.0;
  auVar163._20_4_ = auVar198._20_4_ * 0.0;
  auVar163._24_4_ = auVar198._24_4_ * 0.0;
  auVar163._28_4_ = auVar198._28_4_;
  auVar198 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar194));
  auVar161._4_4_ = auVar8._4_4_ * auVar198._4_4_;
  auVar161._0_4_ = auVar8._0_4_ * auVar198._0_4_;
  auVar161._8_4_ = auVar8._8_4_ * auVar198._8_4_;
  auVar161._12_4_ = auVar8._12_4_ * auVar198._12_4_;
  auVar161._16_4_ = auVar198._16_4_ * 0.0;
  auVar161._20_4_ = auVar198._20_4_ * 0.0;
  auVar161._24_4_ = auVar198._24_4_ * 0.0;
  auVar161._28_4_ = auVar198._28_4_;
  auVar198 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar111));
  auVar22._4_4_ = auVar9._4_4_ * auVar198._4_4_;
  auVar22._0_4_ = auVar9._0_4_ * auVar198._0_4_;
  auVar22._8_4_ = auVar9._8_4_ * auVar198._8_4_;
  auVar22._12_4_ = auVar9._12_4_ * auVar198._12_4_;
  auVar22._16_4_ = auVar198._16_4_ * 0.0;
  auVar22._20_4_ = auVar198._20_4_ * 0.0;
  auVar22._24_4_ = auVar198._24_4_ * 0.0;
  auVar22._28_4_ = auVar198._28_4_;
  auVar198 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar111));
  auVar120._4_4_ = auVar9._4_4_ * auVar198._4_4_;
  auVar120._0_4_ = auVar9._0_4_ * auVar198._0_4_;
  auVar120._8_4_ = auVar9._8_4_ * auVar198._8_4_;
  auVar120._12_4_ = auVar9._12_4_ * auVar198._12_4_;
  auVar120._16_4_ = auVar198._16_4_ * 0.0;
  auVar120._20_4_ = auVar198._20_4_ * 0.0;
  auVar120._24_4_ = auVar198._24_4_ * 0.0;
  auVar120._28_4_ = auVar198._28_4_;
  auVar198 = vpminsd_avx2(auVar121,auVar185);
  auVar20 = vpminsd_avx2(auVar163,auVar161);
  auVar198 = vmaxps_avx(auVar198,auVar20);
  auVar20 = vpminsd_avx2(auVar22,auVar120);
  uVar107 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar202._4_4_ = uVar107;
  auVar202._0_4_ = uVar107;
  auVar202._8_4_ = uVar107;
  auVar202._12_4_ = uVar107;
  auVar202._16_4_ = uVar107;
  auVar202._20_4_ = uVar107;
  auVar202._24_4_ = uVar107;
  auVar202._28_4_ = uVar107;
  auVar20 = vmaxps_avx(auVar20,auVar202);
  auVar198 = vmaxps_avx(auVar198,auVar20);
  local_80._4_4_ = auVar198._4_4_ * 0.99999964;
  local_80._0_4_ = auVar198._0_4_ * 0.99999964;
  local_80._8_4_ = auVar198._8_4_ * 0.99999964;
  local_80._12_4_ = auVar198._12_4_ * 0.99999964;
  local_80._16_4_ = auVar198._16_4_ * 0.99999964;
  local_80._20_4_ = auVar198._20_4_ * 0.99999964;
  local_80._24_4_ = auVar198._24_4_ * 0.99999964;
  local_80._28_4_ = auVar198._28_4_;
  auVar198 = vpmaxsd_avx2(auVar121,auVar185);
  auVar20 = vpmaxsd_avx2(auVar163,auVar161);
  auVar198 = vminps_avx(auVar198,auVar20);
  fVar147 = (ray->super_RayK<1>).tfar;
  auVar160._4_4_ = fVar147;
  auVar160._0_4_ = fVar147;
  auVar160._8_4_ = fVar147;
  auVar160._12_4_ = fVar147;
  auVar160._16_4_ = fVar147;
  auVar160._20_4_ = fVar147;
  auVar160._24_4_ = fVar147;
  auVar160._28_4_ = fVar147;
  auVar20 = vpmaxsd_avx2(auVar22,auVar120);
  auVar20 = vminps_avx(auVar20,auVar160);
  auVar198 = vminps_avx(auVar198,auVar20);
  auVar21._4_4_ = auVar198._4_4_ * 1.0000004;
  auVar21._0_4_ = auVar198._0_4_ * 1.0000004;
  auVar21._8_4_ = auVar198._8_4_ * 1.0000004;
  auVar21._12_4_ = auVar198._12_4_ * 1.0000004;
  auVar21._16_4_ = auVar198._16_4_ * 1.0000004;
  auVar21._20_4_ = auVar198._20_4_ * 1.0000004;
  auVar21._24_4_ = auVar198._24_4_ * 1.0000004;
  auVar21._28_4_ = auVar198._28_4_;
  auVar126[4] = PVar16;
  auVar126._5_3_ = 0;
  auVar126[8] = PVar16;
  auVar126._9_3_ = 0;
  auVar126[0xc] = PVar16;
  auVar126._13_3_ = 0;
  auVar126[0x10] = PVar16;
  auVar126._17_3_ = 0;
  auVar126[0x14] = PVar16;
  auVar126._21_3_ = 0;
  auVar126[0x18] = PVar16;
  auVar126._25_3_ = 0;
  auVar126[0x1c] = PVar16;
  auVar126._29_3_ = 0;
  auVar198 = vcmpps_avx(local_80,auVar21,2);
  auVar20 = vpcmpgtd_avx2(auVar126,_DAT_01fb4ba0);
  auVar198 = vandps_avx(auVar198,auVar20);
  uVar107 = vmovmskps_avx(auVar198);
  uVar100 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar107);
  local_520[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_520[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_520[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_520[1]._24_8_ = mm_lookupmask_ps._24_8_;
  local_720 = prim;
  local_7f0 = ray;
  do {
    auVar198 = _local_460;
    if (uVar100 == 0) {
      return;
    }
    lVar102 = 0;
    for (uVar108 = uVar100; (uVar108 & 1) == 0; uVar108 = uVar108 >> 1 | 0x8000000000000000) {
      lVar102 = lVar102 + 1;
    }
    uVar101 = *(uint *)(prim + 2);
    uVar99 = *(uint *)(prim + lVar102 * 4 + 6);
    local_7e8 = (ulong)uVar101;
    pGVar106 = (context->scene->geometries).items[uVar101].ptr;
    local_7a8 = (ulong)uVar99;
    uVar108 = (ulong)*(uint *)(*(long *)&pGVar106->field_0x58 +
                              (ulong)uVar99 *
                              pGVar106[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar147 = (pGVar106->time_range).lower;
    fVar147 = pGVar106->fnumTimeSegments *
              (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar147) /
              ((pGVar106->time_range).upper - fVar147));
    auVar173 = vroundss_avx(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),9);
    auVar173 = vminss_avx(auVar173,ZEXT416((uint)(pGVar106->fnumTimeSegments + -1.0)));
    auVar173 = vmaxss_avx(ZEXT816(0) << 0x20,auVar173);
    fVar147 = fVar147 - auVar173._0_4_;
    _Var18 = pGVar106[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar104 = (long)(int)auVar173._0_4_ * 0x38;
    lVar102 = *(long *)(_Var18 + 0x10 + lVar104);
    lVar103 = *(long *)(_Var18 + 0x38 + lVar104);
    lVar105 = *(long *)(_Var18 + 0x48 + lVar104);
    pfVar1 = (float *)(lVar103 + uVar108 * lVar105);
    auVar189._0_4_ = fVar147 * *pfVar1;
    auVar189._4_4_ = fVar147 * pfVar1[1];
    auVar189._8_4_ = fVar147 * pfVar1[2];
    auVar189._12_4_ = fVar147 * pfVar1[3];
    pfVar1 = (float *)(lVar103 + (uVar108 + 1) * lVar105);
    auVar148._0_4_ = fVar147 * *pfVar1;
    auVar148._4_4_ = fVar147 * pfVar1[1];
    auVar148._8_4_ = fVar147 * pfVar1[2];
    auVar148._12_4_ = fVar147 * pfVar1[3];
    pfVar1 = (float *)(lVar103 + (uVar108 + 2) * lVar105);
    auVar165._0_4_ = fVar147 * *pfVar1;
    auVar165._4_4_ = fVar147 * pfVar1[1];
    auVar165._8_4_ = fVar147 * pfVar1[2];
    auVar165._12_4_ = fVar147 * pfVar1[3];
    pfVar1 = (float *)(lVar103 + lVar105 * (uVar108 + 3));
    auVar170._0_4_ = fVar147 * *pfVar1;
    auVar170._4_4_ = fVar147 * pfVar1[1];
    auVar170._8_4_ = fVar147 * pfVar1[2];
    auVar170._12_4_ = fVar147 * pfVar1[3];
    lVar103 = *(long *)(_Var18 + lVar104);
    fVar147 = 1.0 - fVar147;
    auVar111._4_4_ = fVar147;
    auVar111._0_4_ = fVar147;
    auVar111._8_4_ = fVar147;
    auVar111._12_4_ = fVar147;
    local_730 = vfmadd231ps_fma(auVar189,auVar111,
                                *(undefined1 (*) [16])(lVar103 + lVar102 * uVar108));
    auVar189 = local_730;
    local_740 = vfmadd231ps_fma(auVar148,auVar111,
                                *(undefined1 (*) [16])(lVar103 + lVar102 * (uVar108 + 1)));
    auVar148 = local_740;
    local_750 = vfmadd231ps_fma(auVar165,auVar111,
                                *(undefined1 (*) [16])(lVar103 + lVar102 * (uVar108 + 2)));
    _local_760 = vfmadd231ps_fma(auVar170,auVar111,
                                 *(undefined1 (*) [16])(lVar103 + lVar102 * (uVar108 + 3)));
    iVar17 = (int)pGVar106[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar5 = (local_7f0->super_RayK<1>).org.field_0;
    auVar8 = vsubps_avx(local_730,(undefined1  [16])aVar5);
    local_7a0._0_16_ = (undefined1  [16])aVar5;
    uVar107 = auVar8._0_4_;
    auVar149._4_4_ = uVar107;
    auVar149._0_4_ = uVar107;
    auVar149._8_4_ = uVar107;
    auVar149._12_4_ = uVar107;
    auVar173 = vshufps_avx(auVar8,auVar8,0x55);
    auVar8 = vshufps_avx(auVar8,auVar8,0xaa);
    aVar6 = (local_718->ray_space).vx.field_0;
    aVar7 = (local_718->ray_space).vy.field_0;
    fVar147 = (local_718->ray_space).vz.field_0.m128[0];
    fVar141 = (local_718->ray_space).vz.field_0.m128[1];
    fVar142 = (local_718->ray_space).vz.field_0.m128[2];
    fVar143 = (local_718->ray_space).vz.field_0.m128[3];
    auVar183._0_4_ = auVar8._0_4_ * fVar147;
    auVar183._4_4_ = auVar8._4_4_ * fVar141;
    auVar183._8_4_ = auVar8._8_4_ * fVar142;
    auVar183._12_4_ = auVar8._12_4_ * fVar143;
    auVar173 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar7,auVar173);
    auVar12 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar6,auVar149);
    auVar173 = vblendps_avx(auVar12,local_730,8);
    auVar9 = vsubps_avx(local_740,(undefined1  [16])aVar5);
    uVar107 = auVar9._0_4_;
    auVar184._4_4_ = uVar107;
    auVar184._0_4_ = uVar107;
    auVar184._8_4_ = uVar107;
    auVar184._12_4_ = uVar107;
    auVar8 = vshufps_avx(auVar9,auVar9,0x55);
    auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
    auVar221._0_4_ = auVar9._0_4_ * fVar147;
    auVar221._4_4_ = auVar9._4_4_ * fVar141;
    auVar221._8_4_ = auVar9._8_4_ * fVar142;
    auVar221._12_4_ = auVar9._12_4_ * fVar143;
    auVar8 = vfmadd231ps_fma(auVar221,(undefined1  [16])aVar7,auVar8);
    auVar13 = vfmadd231ps_fma(auVar8,(undefined1  [16])aVar6,auVar184);
    auVar8 = vblendps_avx(auVar13,local_740,8);
    auVar111 = local_750;
    auVar10 = vsubps_avx(local_750,(undefined1  [16])aVar5);
    uVar107 = auVar10._0_4_;
    auVar190._4_4_ = uVar107;
    auVar190._0_4_ = uVar107;
    auVar190._8_4_ = uVar107;
    auVar190._12_4_ = uVar107;
    auVar9 = vshufps_avx(auVar10,auVar10,0x55);
    auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
    auVar225._0_4_ = auVar10._0_4_ * fVar147;
    auVar225._4_4_ = auVar10._4_4_ * fVar141;
    auVar225._8_4_ = auVar10._8_4_ * fVar142;
    auVar225._12_4_ = auVar10._12_4_ * fVar143;
    auVar9 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar7,auVar9);
    auVar14 = vfmadd231ps_fma(auVar9,(undefined1  [16])aVar6,auVar190);
    auVar9 = vblendps_avx(auVar14,local_750,8);
    auVar194 = _local_760;
    auVar11 = vsubps_avx(_local_760,(undefined1  [16])aVar5);
    auVar10 = vshufps_avx(auVar11,auVar11,0xaa);
    auVar195._0_4_ = auVar10._0_4_ * fVar147;
    auVar195._4_4_ = auVar10._4_4_ * fVar141;
    auVar195._8_4_ = auVar10._8_4_ * fVar142;
    auVar195._12_4_ = auVar10._12_4_ * fVar143;
    uVar107 = auVar11._0_4_;
    auVar166._4_4_ = uVar107;
    auVar166._0_4_ = uVar107;
    auVar166._8_4_ = uVar107;
    auVar166._12_4_ = uVar107;
    auVar10 = vshufps_avx(auVar11,auVar11,0x55);
    auVar10 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar7,auVar10);
    auVar15 = vfmadd231ps_fma(auVar10,(undefined1  [16])aVar6,auVar166);
    auVar10 = vblendps_avx(auVar15,_local_760,8);
    auVar125._8_4_ = 0x7fffffff;
    auVar125._0_8_ = 0x7fffffff7fffffff;
    auVar125._12_4_ = 0x7fffffff;
    auVar173 = vandps_avx(auVar173,auVar125);
    auVar8 = vandps_avx(auVar8,auVar125);
    auVar11 = vmaxps_avx(auVar173,auVar8);
    auVar173 = vandps_avx(auVar9,auVar125);
    auVar8 = vandps_avx(auVar10,auVar125);
    auVar173 = vmaxps_avx(auVar173,auVar8);
    auVar173 = vmaxps_avx(auVar11,auVar173);
    auVar8 = vmovshdup_avx(auVar173);
    auVar8 = vmaxss_avx(auVar8,auVar173);
    auVar173 = vshufpd_avx(auVar173,auVar173,1);
    auVar173 = vmaxss_avx(auVar173,auVar8);
    local_7b0 = (long)iVar17;
    lVar102 = local_7b0 * 0x44;
    auVar8 = vmovshdup_avx(auVar12);
    uVar109 = auVar8._0_8_;
    local_400._8_8_ = uVar109;
    local_400._0_8_ = uVar109;
    local_400._16_8_ = uVar109;
    local_400._24_8_ = uVar109;
    auVar9 = vmovshdup_avx(auVar13);
    uVar109 = auVar9._0_8_;
    local_420._8_8_ = uVar109;
    local_420._0_8_ = uVar109;
    local_420._16_8_ = uVar109;
    local_420._24_8_ = uVar109;
    auVar20 = *(undefined1 (*) [32])(bspline_basis0 + lVar102 + 0x908);
    uVar223 = auVar14._0_4_;
    local_540._4_4_ = uVar223;
    local_540._0_4_ = uVar223;
    local_540._8_4_ = uVar223;
    local_540._12_4_ = uVar223;
    local_540._16_4_ = uVar223;
    local_540._20_4_ = uVar223;
    local_540._24_4_ = uVar223;
    local_540._28_4_ = uVar223;
    auVar9 = vmovshdup_avx(auVar14);
    uVar109 = auVar9._0_8_;
    local_6e0._8_8_ = uVar109;
    local_6e0._0_8_ = uVar109;
    local_6e0._16_8_ = uVar109;
    local_6e0._24_8_ = uVar109;
    auVar9 = vmovshdup_avx(auVar15);
    local_5a0 = auVar9._0_8_;
    pauVar2 = (undefined1 (*) [32])(bspline_basis0 + lVar102 + 0xd8c);
    fVar141 = *(float *)*pauVar2;
    local_460._4_4_ = *(undefined4 *)(bspline_basis0 + lVar102 + 0xd90);
    fStack_458 = *(float *)(bspline_basis0 + lVar102 + 0xd94);
    fStack_454 = *(float *)(bspline_basis0 + lVar102 + 0xd98);
    fVar142 = *(float *)(bspline_basis0 + lVar102 + 0xd9c);
    fVar143 = *(float *)(bspline_basis0 + lVar102 + 0xda0);
    fVar144 = *(float *)(bspline_basis0 + lVar102 + 0xda4);
    auVar96 = *(undefined1 (*) [28])*pauVar2;
    local_5c0 = auVar15._0_4_;
    auVar127._0_4_ = fVar141 * local_5c0;
    auVar127._4_4_ = (float)local_460._4_4_ * local_5c0;
    auVar127._8_4_ = fStack_458 * local_5c0;
    auVar127._12_4_ = fStack_454 * local_5c0;
    auVar127._16_4_ = fVar142 * local_5c0;
    auVar127._20_4_ = fVar143 * local_5c0;
    auVar127._24_4_ = fVar144 * local_5c0;
    auVar127._28_4_ = 0;
    auVar10 = vfmadd231ps_fma(auVar127,auVar20,local_540);
    fVar224 = auVar9._0_4_;
    auVar114._0_4_ = fVar224 * fVar141;
    fVar231 = auVar9._4_4_;
    auVar114._4_4_ = fVar231 * (float)local_460._4_4_;
    auVar114._8_4_ = fVar224 * fStack_458;
    auVar114._12_4_ = fVar231 * fStack_454;
    auVar114._16_4_ = fVar224 * fVar142;
    auVar114._20_4_ = fVar231 * fVar143;
    auVar114._24_4_ = fVar224 * fVar144;
    auVar114._28_4_ = 0;
    auVar9 = vfmadd231ps_fma(auVar114,auVar20,local_6e0);
    auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar102 + 0x484);
    uVar107 = auVar13._0_4_;
    local_6c0._4_4_ = uVar107;
    local_6c0._0_4_ = uVar107;
    local_6c0._8_4_ = uVar107;
    local_6c0._12_4_ = uVar107;
    local_6c0._16_4_ = uVar107;
    local_6c0._20_4_ = uVar107;
    local_6c0._24_4_ = uVar107;
    local_6c0._28_4_ = uVar107;
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar121,local_6c0);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar121,local_420);
    auVar163 = *(undefined1 (*) [32])(bspline_basis0 + lVar102);
    uVar107 = auVar12._0_4_;
    local_780._4_4_ = uVar107;
    local_780._0_4_ = uVar107;
    local_780._8_4_ = uVar107;
    local_780._12_4_ = uVar107;
    local_780._16_4_ = uVar107;
    local_780._20_4_ = uVar107;
    local_780._24_4_ = uVar107;
    local_780._28_4_ = uVar107;
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar163,local_780);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar163,local_400);
    auVar161 = *(undefined1 (*) [32])(bspline_basis1 + lVar102 + 0x908);
    fVar145 = *(float *)(bspline_basis1 + lVar102 + 0xd8c);
    fVar146 = *(float *)(bspline_basis1 + lVar102 + 0xd90);
    fVar219 = *(float *)(bspline_basis1 + lVar102 + 0xd94);
    fVar200 = *(float *)(bspline_basis1 + lVar102 + 0xd98);
    fVar206 = *(float *)(bspline_basis1 + lVar102 + 0xd9c);
    fVar208 = *(float *)(bspline_basis1 + lVar102 + 0xda0);
    fVar210 = *(float *)(bspline_basis1 + lVar102 + 0xda4);
    fStack_5bc = local_5c0;
    fStack_5b8 = local_5c0;
    fStack_5b4 = local_5c0;
    fStack_5b0 = local_5c0;
    fStack_5ac = local_5c0;
    fStack_5a8 = local_5c0;
    fStack_5a4 = local_5c0;
    auVar24._4_4_ = fVar146 * local_5c0;
    auVar24._0_4_ = fVar145 * local_5c0;
    auVar24._8_4_ = fVar219 * local_5c0;
    auVar24._12_4_ = fVar200 * local_5c0;
    auVar24._16_4_ = fVar206 * local_5c0;
    auVar24._20_4_ = fVar208 * local_5c0;
    auVar24._24_4_ = fVar210 * local_5c0;
    auVar24._28_4_ = local_5c0;
    auVar11 = vfmadd231ps_fma(auVar24,auVar161,local_540);
    uStack_598 = local_5a0;
    uStack_590 = local_5a0;
    uStack_588 = local_5a0;
    auVar25._4_4_ = fVar231 * fVar146;
    auVar25._0_4_ = fVar224 * fVar145;
    auVar25._8_4_ = fVar224 * fVar219;
    auVar25._12_4_ = fVar231 * fVar200;
    auVar25._16_4_ = fVar224 * fVar206;
    auVar25._20_4_ = fVar231 * fVar208;
    auVar25._24_4_ = fVar224 * fVar210;
    auVar25._28_4_ = uVar223;
    auVar110 = vfmadd231ps_fma(auVar25,auVar161,local_6e0);
    auVar22 = *(undefined1 (*) [32])(bspline_basis1 + lVar102 + 0x484);
    auVar229 = ZEXT3264(auVar22);
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar22,local_6c0);
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar22,local_420);
    auVar120 = *(undefined1 (*) [32])(bspline_basis1 + lVar102);
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar120,local_780);
    auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar120,local_400);
    local_300 = ZEXT1632(auVar11);
    auVar112 = ZEXT1632(auVar10);
    local_4e0 = vsubps_avx(local_300,auVar112);
    _local_320 = ZEXT1632(auVar110);
    auVar115 = ZEXT1632(auVar9);
    local_340 = vsubps_avx(_local_320,auVar115);
    auVar116._0_4_ = auVar9._0_4_ * local_4e0._0_4_;
    auVar116._4_4_ = auVar9._4_4_ * local_4e0._4_4_;
    auVar116._8_4_ = auVar9._8_4_ * local_4e0._8_4_;
    auVar116._12_4_ = auVar9._12_4_ * local_4e0._12_4_;
    auVar116._16_4_ = local_4e0._16_4_ * 0.0;
    auVar116._20_4_ = local_4e0._20_4_ * 0.0;
    auVar116._24_4_ = local_4e0._24_4_ * 0.0;
    auVar116._28_4_ = 0;
    fVar199 = local_340._0_4_;
    auVar128._0_4_ = fVar199 * auVar10._0_4_;
    fVar205 = local_340._4_4_;
    auVar128._4_4_ = fVar205 * auVar10._4_4_;
    fVar207 = local_340._8_4_;
    auVar128._8_4_ = fVar207 * auVar10._8_4_;
    fVar209 = local_340._12_4_;
    auVar128._12_4_ = fVar209 * auVar10._12_4_;
    fVar211 = local_340._16_4_;
    auVar128._16_4_ = fVar211 * 0.0;
    fVar212 = local_340._20_4_;
    auVar128._20_4_ = fVar212 * 0.0;
    fVar213 = local_340._24_4_;
    auVar128._24_4_ = fVar213 * 0.0;
    auVar128._28_4_ = 0;
    auVar160 = vsubps_avx(auVar116,auVar128);
    auVar9 = vpermilps_avx(local_730,0xff);
    uVar109 = auVar9._0_8_;
    local_a0._8_8_ = uVar109;
    local_a0._0_8_ = uVar109;
    local_a0._16_8_ = uVar109;
    local_a0._24_8_ = uVar109;
    auVar9 = vpermilps_avx(local_740,0xff);
    uVar109 = auVar9._0_8_;
    local_c0._8_8_ = uVar109;
    local_c0._0_8_ = uVar109;
    local_c0._16_8_ = uVar109;
    local_c0._24_8_ = uVar109;
    auVar9 = vpermilps_avx(local_750,0xff);
    uVar109 = auVar9._0_8_;
    local_e0._8_8_ = uVar109;
    local_e0._0_8_ = uVar109;
    local_e0._16_8_ = uVar109;
    local_e0._24_8_ = uVar109;
    auVar9 = vpermilps_avx(_local_760,0xff);
    local_100 = auVar9._0_8_;
    _local_440 = *pauVar2;
    auVar215 = _local_440;
    fVar147 = auVar9._0_4_;
    auVar197._0_4_ = fVar141 * fVar147;
    fVar141 = auVar9._4_4_;
    auVar197._4_4_ = (float)local_460._4_4_ * fVar141;
    auVar197._8_4_ = fStack_458 * fVar147;
    auVar197._12_4_ = fStack_454 * fVar141;
    auVar197._16_4_ = fVar142 * fVar147;
    auVar197._20_4_ = fVar143 * fVar141;
    auVar197._24_4_ = fVar144 * fVar147;
    auVar197._28_4_ = 0;
    auVar9 = vfmadd231ps_fma(auVar197,auVar20,local_e0);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar121,local_c0);
    auVar10 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar163,local_a0);
    uStack_f8 = local_100;
    uStack_f0 = local_100;
    uStack_e8 = local_100;
    auVar26._4_4_ = fVar146 * fVar141;
    auVar26._0_4_ = fVar145 * fVar147;
    auVar26._8_4_ = fVar219 * fVar147;
    auVar26._12_4_ = fVar200 * fVar141;
    auVar26._16_4_ = fVar206 * fVar147;
    auVar26._20_4_ = fVar208 * fVar141;
    auVar26._24_4_ = fVar210 * fVar147;
    auVar26._28_4_ = auVar20._28_4_;
    auVar9 = vfmadd231ps_fma(auVar26,auVar161,local_e0);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar22,local_c0);
    auVar11 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar120,local_a0);
    auVar232 = ZEXT1664(auVar11);
    auVar27._4_4_ = fVar205 * fVar205;
    auVar27._0_4_ = fVar199 * fVar199;
    auVar27._8_4_ = fVar207 * fVar207;
    auVar27._12_4_ = fVar209 * fVar209;
    auVar27._16_4_ = fVar211 * fVar211;
    auVar27._20_4_ = fVar212 * fVar212;
    auVar27._24_4_ = fVar213 * fVar213;
    auVar27._28_4_ = local_340._28_4_;
    auVar9 = vfmadd231ps_fma(auVar27,local_4e0,local_4e0);
    auVar21 = vmaxps_avx(ZEXT1632(auVar10),ZEXT1632(auVar11));
    auVar28._4_4_ = auVar9._4_4_ * auVar21._4_4_ * auVar21._4_4_;
    auVar28._0_4_ = auVar9._0_4_ * auVar21._0_4_ * auVar21._0_4_;
    auVar28._8_4_ = auVar9._8_4_ * auVar21._8_4_ * auVar21._8_4_;
    auVar28._12_4_ = auVar9._12_4_ * auVar21._12_4_ * auVar21._12_4_;
    auVar28._16_4_ = auVar21._16_4_ * auVar21._16_4_ * 0.0;
    auVar28._20_4_ = auVar21._20_4_ * auVar21._20_4_ * 0.0;
    auVar28._24_4_ = auVar21._24_4_ * auVar21._24_4_ * 0.0;
    auVar28._28_4_ = auVar21._28_4_;
    auVar29._4_4_ = auVar160._4_4_ * auVar160._4_4_;
    auVar29._0_4_ = auVar160._0_4_ * auVar160._0_4_;
    auVar29._8_4_ = auVar160._8_4_ * auVar160._8_4_;
    auVar29._12_4_ = auVar160._12_4_ * auVar160._12_4_;
    auVar29._16_4_ = auVar160._16_4_ * auVar160._16_4_;
    auVar29._20_4_ = auVar160._20_4_ * auVar160._20_4_;
    auVar29._24_4_ = auVar160._24_4_ * auVar160._24_4_;
    auVar29._28_4_ = auVar160._28_4_;
    auVar21 = vcmpps_avx(auVar29,auVar28,2);
    fVar147 = auVar173._0_4_ * 4.7683716e-07;
    auVar129._0_4_ = (float)iVar17;
    local_460._0_4_ = auVar129._0_4_;
    auStack_450 = auVar198._16_16_;
    auVar129._4_4_ = auVar129._0_4_;
    auVar129._8_4_ = auVar129._0_4_;
    auVar129._12_4_ = auVar129._0_4_;
    auVar129._16_4_ = auVar129._0_4_;
    auVar129._20_4_ = auVar129._0_4_;
    auVar129._24_4_ = auVar129._0_4_;
    auVar129._28_4_ = auVar129._0_4_;
    auVar198 = vcmpps_avx(_DAT_01f7b060,auVar129,1);
    auVar173 = vpermilps_avx(auVar12,0xaa);
    uStack_558 = auVar173._0_8_;
    local_560 = auVar173._0_4_;
    uStack_55c = auVar173._4_4_;
    uStack_550 = uStack_558;
    uStack_548 = uStack_558;
    auVar173 = vpermilps_avx(auVar13,0xaa);
    uVar109 = auVar173._0_8_;
    local_6a0._8_8_ = uVar109;
    local_6a0._0_8_ = uVar109;
    local_6a0._16_8_ = uVar109;
    local_6a0._24_8_ = uVar109;
    auVar173 = vpermilps_avx(auVar14,0xaa);
    local_480 = auVar173._0_8_;
    uStack_478 = local_480;
    uStack_470 = local_480;
    uStack_468 = local_480;
    auVar173 = vpermilps_avx(auVar15,0xaa);
    uVar124 = auVar173._0_8_;
    auVar160 = auVar198 & auVar21;
    auVar9 = vpermilps_avx((undefined1  [16])aVar5,0xff);
    uVar109 = auVar9._0_8_;
    _local_620 = ZEXT416((uint)fVar147);
    ray = local_7f0;
    uVar235 = uVar124;
    uVar236 = uVar124;
    uVar237 = uVar124;
    if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar160 >> 0x7f,0) == '\0') &&
          (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar160 >> 0xbf,0) == '\0') &&
        (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar160[0x1f])
    {
      auVar140 = ZEXT3264(local_5e0);
      auVar169 = ZEXT3264(local_540);
      auVar239 = ZEXT3264(local_6e0);
      auVar218 = ZEXT3264(local_6c0);
      auVar220 = ZEXT3264(local_780);
    }
    else {
      local_7a0._0_16_ = auVar9;
      auVar21 = vandps_avx(auVar198,auVar21);
      local_680 = uVar124;
      uStack_678 = uVar124;
      uStack_670 = uVar124;
      uStack_668 = uVar124;
      fVar199 = auVar173._0_4_;
      fVar205 = auVar173._4_4_;
      auVar198._4_4_ = fVar205 * fVar146;
      auVar198._0_4_ = fVar199 * fVar145;
      auVar198._8_4_ = fVar199 * fVar219;
      auVar198._12_4_ = fVar205 * fVar200;
      auVar198._16_4_ = fVar199 * fVar206;
      auVar198._20_4_ = fVar205 * fVar208;
      auVar198._24_4_ = fVar199 * fVar210;
      auVar198._28_4_ = auVar21._28_4_;
      auVar91._8_8_ = local_480;
      auVar91._0_8_ = local_480;
      auVar91._16_8_ = local_480;
      auVar91._24_8_ = local_480;
      auVar173 = vfmadd213ps_fma(auVar161,auVar91,auVar198);
      auVar173 = vfmadd213ps_fma(auVar22,local_6a0,ZEXT1632(auVar173));
      auVar86._8_8_ = uStack_558;
      auVar86._0_8_ = uStack_558;
      auVar86._16_8_ = uStack_558;
      auVar86._24_8_ = uStack_558;
      auVar173 = vfmadd132ps_fma(auVar120,ZEXT1632(auVar173),auVar86);
      local_360 = ZEXT1632(auVar173);
      local_440._0_4_ = auVar96._0_4_;
      local_440._4_4_ = auVar96._4_4_;
      fStack_438 = auVar96._8_4_;
      fStack_434 = auVar96._12_4_;
      fStack_430 = auVar96._16_4_;
      fStack_42c = auVar96._20_4_;
      fStack_428 = auVar96._24_4_;
      auVar30._4_4_ = fVar205 * (float)local_440._4_4_;
      auVar30._0_4_ = fVar199 * (float)local_440._0_4_;
      auVar30._8_4_ = fVar199 * fStack_438;
      auVar30._12_4_ = fVar205 * fStack_434;
      auVar30._16_4_ = fVar199 * fStack_430;
      auVar30._20_4_ = fVar205 * fStack_42c;
      auVar30._24_4_ = fVar199 * fStack_428;
      auVar30._28_4_ = auVar21._28_4_;
      auVar173 = vfmadd213ps_fma(auVar20,auVar91,auVar30);
      auVar173 = vfmadd213ps_fma(auVar121,local_6a0,ZEXT1632(auVar173));
      auVar198 = *(undefined1 (*) [32])(bspline_basis0 + lVar102 + 0x1210);
      auVar20 = *(undefined1 (*) [32])(bspline_basis0 + lVar102 + 0x1694);
      auVar121 = *(undefined1 (*) [32])(bspline_basis0 + lVar102 + 0x1b18);
      fVar141 = *(float *)(bspline_basis0 + lVar102 + 0x1f9c);
      fVar142 = *(float *)(bspline_basis0 + lVar102 + 0x1fa0);
      fVar143 = *(float *)(bspline_basis0 + lVar102 + 0x1fa4);
      fVar144 = *(float *)(bspline_basis0 + lVar102 + 0x1fa8);
      fVar145 = *(float *)(bspline_basis0 + lVar102 + 0x1fac);
      fVar146 = *(float *)(bspline_basis0 + lVar102 + 0x1fb0);
      fVar219 = *(float *)(bspline_basis0 + lVar102 + 0x1fb4);
      auVar31._4_4_ = fVar142 * local_5c0;
      auVar31._0_4_ = fVar141 * local_5c0;
      auVar31._8_4_ = fVar143 * local_5c0;
      auVar31._12_4_ = fVar144 * local_5c0;
      auVar31._16_4_ = fVar145 * local_5c0;
      auVar31._20_4_ = fVar146 * local_5c0;
      auVar31._24_4_ = fVar219 * local_5c0;
      auVar31._28_4_ = local_4e0._28_4_;
      auVar32._4_4_ = fVar231 * fVar142;
      auVar32._0_4_ = fVar224 * fVar141;
      auVar32._8_4_ = fVar224 * fVar143;
      auVar32._12_4_ = fVar231 * fVar144;
      auVar32._16_4_ = fVar224 * fVar145;
      auVar32._20_4_ = fVar231 * fVar146;
      auVar32._24_4_ = fVar224 * fVar219;
      auVar32._28_4_ = auVar163._28_4_;
      auVar33._4_4_ = fVar205 * fVar142;
      auVar33._0_4_ = fVar199 * fVar141;
      auVar33._8_4_ = fVar199 * fVar143;
      auVar33._12_4_ = fVar205 * fVar144;
      auVar33._16_4_ = fVar199 * fVar145;
      auVar33._20_4_ = fVar205 * fVar146;
      auVar33._24_4_ = fVar199 * fVar219;
      auVar33._28_4_ = *(undefined4 *)(bspline_basis0 + lVar102 + 0x1fb8);
      auVar9 = vfmadd231ps_fma(auVar31,auVar121,local_540);
      auVar12 = vfmadd231ps_fma(auVar32,auVar121,local_6e0);
      auVar13 = vfmadd231ps_fma(auVar33,auVar91,auVar121);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar20,local_6c0);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar20,local_420);
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),local_6a0,auVar20);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar198,local_780);
      auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar198,local_400);
      auVar87._8_8_ = uStack_558;
      auVar87._0_8_ = uStack_558;
      auVar87._16_8_ = uStack_558;
      auVar87._24_8_ = uStack_558;
      auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar198,auVar87);
      fVar141 = *(float *)(bspline_basis1 + lVar102 + 0x1f9c);
      fVar142 = *(float *)(bspline_basis1 + lVar102 + 0x1fa0);
      fVar143 = *(float *)(bspline_basis1 + lVar102 + 0x1fa4);
      fVar144 = *(float *)(bspline_basis1 + lVar102 + 0x1fa8);
      fVar145 = *(float *)(bspline_basis1 + lVar102 + 0x1fac);
      fVar146 = *(float *)(bspline_basis1 + lVar102 + 0x1fb0);
      fVar219 = *(float *)(bspline_basis1 + lVar102 + 0x1fb4);
      auVar34._4_4_ = local_5c0 * fVar142;
      auVar34._0_4_ = local_5c0 * fVar141;
      auVar34._8_4_ = local_5c0 * fVar143;
      auVar34._12_4_ = local_5c0 * fVar144;
      auVar34._16_4_ = local_5c0 * fVar145;
      auVar34._20_4_ = local_5c0 * fVar146;
      auVar34._24_4_ = local_5c0 * fVar219;
      auVar34._28_4_ = auVar121._28_4_;
      auVar35._4_4_ = fVar231 * fVar142;
      auVar35._0_4_ = fVar224 * fVar141;
      auVar35._8_4_ = fVar224 * fVar143;
      auVar35._12_4_ = fVar231 * fVar144;
      auVar35._16_4_ = fVar224 * fVar145;
      auVar35._20_4_ = fVar231 * fVar146;
      auVar35._24_4_ = fVar224 * fVar219;
      auVar35._28_4_ = fVar231;
      auVar36._4_4_ = fVar142 * fVar205;
      auVar36._0_4_ = fVar141 * fVar199;
      auVar36._8_4_ = fVar143 * fVar199;
      auVar36._12_4_ = fVar144 * fVar205;
      auVar36._16_4_ = fVar145 * fVar199;
      auVar36._20_4_ = fVar146 * fVar205;
      auVar36._24_4_ = fVar219 * fVar199;
      auVar36._28_4_ = *(undefined4 *)(bspline_basis1 + lVar102 + 0x1fb8);
      auVar198 = *(undefined1 (*) [32])(bspline_basis1 + lVar102 + 0x1b18);
      auVar14 = vfmadd231ps_fma(auVar34,auVar198,local_540);
      auVar15 = vfmadd231ps_fma(auVar35,auVar198,local_6e0);
      auVar92._8_8_ = local_480;
      auVar92._0_8_ = local_480;
      auVar92._16_8_ = local_480;
      auVar92._24_8_ = local_480;
      auVar110 = vfmadd231ps_fma(auVar36,auVar198,auVar92);
      auVar198 = *(undefined1 (*) [32])(bspline_basis1 + lVar102 + 0x1694);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar198,local_6c0);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar198,local_420);
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar198,local_6a0);
      auVar198 = *(undefined1 (*) [32])(bspline_basis1 + lVar102 + 0x1210);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar198,local_780);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar198,local_400);
      auVar88._8_8_ = uStack_558;
      auVar88._0_8_ = uStack_558;
      auVar88._16_8_ = uStack_558;
      auVar88._24_8_ = uStack_558;
      auVar110 = vfmadd231ps_fma(ZEXT1632(auVar110),auVar88,auVar198);
      auVar198 = vandps_avx(local_1a0,ZEXT1632(auVar9));
      auVar20 = vandps_avx(local_1a0,ZEXT1632(auVar12));
      auVar20 = vmaxps_avx(auVar198,auVar20);
      auVar198 = vandps_avx(ZEXT1632(auVar13),local_1a0);
      auVar198 = vmaxps_avx(auVar20,auVar198);
      auVar214._4_4_ = fVar147;
      auVar214._0_4_ = fVar147;
      auVar214._8_4_ = fVar147;
      auVar214._12_4_ = fVar147;
      auVar214._16_4_ = fVar147;
      auVar214._20_4_ = fVar147;
      auVar214._24_4_ = fVar147;
      auVar214._28_4_ = fVar147;
      auVar198 = vcmpps_avx(auVar198,auVar214,1);
      auVar121 = vblendvps_avx(ZEXT1632(auVar9),local_4e0,auVar198);
      auVar161 = vblendvps_avx(ZEXT1632(auVar12),local_340,auVar198);
      auVar198 = vandps_avx(ZEXT1632(auVar14),local_1a0);
      auVar20 = vandps_avx(ZEXT1632(auVar15),local_1a0);
      auVar22 = vmaxps_avx(auVar198,auVar20);
      auVar198 = vandps_avx(local_1a0,ZEXT1632(auVar110));
      auVar198 = vmaxps_avx(auVar22,auVar198);
      auVar120 = vcmpps_avx(auVar198,auVar214,1);
      auVar198 = vblendvps_avx(ZEXT1632(auVar14),local_4e0,auVar120);
      auVar22 = vblendvps_avx(ZEXT1632(auVar15),local_340,auVar120);
      auVar173 = vfmadd213ps_fma(auVar163,auVar88,ZEXT1632(auVar173));
      auVar9 = vfmadd213ps_fma(auVar121,auVar121,ZEXT832(0) << 0x20);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar161,auVar161);
      auVar163 = vrsqrtps_avx(ZEXT1632(auVar9));
      fVar147 = auVar163._0_4_;
      fVar141 = auVar163._4_4_;
      fVar142 = auVar163._8_4_;
      fVar143 = auVar163._12_4_;
      fVar144 = auVar163._16_4_;
      fVar145 = auVar163._20_4_;
      fVar146 = auVar163._24_4_;
      auVar37._4_4_ = fVar141 * fVar141 * fVar141 * auVar9._4_4_ * -0.5;
      auVar37._0_4_ = fVar147 * fVar147 * fVar147 * auVar9._0_4_ * -0.5;
      auVar37._8_4_ = fVar142 * fVar142 * fVar142 * auVar9._8_4_ * -0.5;
      auVar37._12_4_ = fVar143 * fVar143 * fVar143 * auVar9._12_4_ * -0.5;
      auVar37._16_4_ = fVar144 * fVar144 * fVar144 * -0.0;
      auVar37._20_4_ = fVar145 * fVar145 * fVar145 * -0.0;
      auVar37._24_4_ = fVar146 * fVar146 * fVar146 * -0.0;
      auVar37._28_4_ = auVar20._28_4_;
      auVar191._8_4_ = 0x3fc00000;
      auVar191._0_8_ = 0x3fc000003fc00000;
      auVar191._12_4_ = 0x3fc00000;
      auVar191._16_4_ = 0x3fc00000;
      auVar191._20_4_ = 0x3fc00000;
      auVar191._24_4_ = 0x3fc00000;
      auVar191._28_4_ = 0x3fc00000;
      auVar9 = vfmadd231ps_fma(auVar37,auVar191,auVar163);
      fVar147 = auVar9._0_4_;
      fVar141 = auVar9._4_4_;
      auVar38._4_4_ = fVar141 * auVar161._4_4_;
      auVar38._0_4_ = fVar147 * auVar161._0_4_;
      fVar142 = auVar9._8_4_;
      auVar38._8_4_ = fVar142 * auVar161._8_4_;
      fVar143 = auVar9._12_4_;
      auVar38._12_4_ = fVar143 * auVar161._12_4_;
      auVar38._16_4_ = auVar161._16_4_ * 0.0;
      auVar38._20_4_ = auVar161._20_4_ * 0.0;
      auVar38._24_4_ = auVar161._24_4_ * 0.0;
      auVar38._28_4_ = 0;
      auVar39._4_4_ = fVar141 * -auVar121._4_4_;
      auVar39._0_4_ = fVar147 * -auVar121._0_4_;
      auVar39._8_4_ = fVar142 * -auVar121._8_4_;
      auVar39._12_4_ = fVar143 * -auVar121._12_4_;
      auVar39._16_4_ = -auVar121._16_4_ * 0.0;
      auVar39._20_4_ = -auVar121._20_4_ * 0.0;
      auVar39._24_4_ = -auVar121._24_4_ * 0.0;
      auVar39._28_4_ = auVar163._28_4_;
      auVar9 = vfmadd213ps_fma(auVar198,auVar198,ZEXT832(0) << 0x20);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar22,auVar22);
      auVar20 = vrsqrtps_avx(ZEXT1632(auVar9));
      auVar40._28_4_ = auVar120._28_4_;
      auVar40._0_28_ =
           ZEXT1628(CONCAT412(fVar143 * 0.0,
                              CONCAT48(fVar142 * 0.0,CONCAT44(fVar141 * 0.0,fVar147 * 0.0))));
      fVar147 = auVar20._0_4_;
      fVar141 = auVar20._4_4_;
      fVar142 = auVar20._8_4_;
      fVar143 = auVar20._12_4_;
      fVar144 = auVar20._16_4_;
      fVar145 = auVar20._20_4_;
      fVar146 = auVar20._24_4_;
      auVar226._0_4_ = fVar147 * fVar147 * fVar147 * auVar9._0_4_ * -0.5;
      auVar226._4_4_ = fVar141 * fVar141 * fVar141 * auVar9._4_4_ * -0.5;
      auVar226._8_4_ = fVar142 * fVar142 * fVar142 * auVar9._8_4_ * -0.5;
      auVar226._12_4_ = fVar143 * fVar143 * fVar143 * auVar9._12_4_ * -0.5;
      auVar226._16_4_ = fVar144 * fVar144 * fVar144 * -0.0;
      auVar226._20_4_ = fVar145 * fVar145 * fVar145 * -0.0;
      auVar226._24_4_ = fVar146 * fVar146 * fVar146 * -0.0;
      auVar226._28_4_ = 0;
      auVar9 = vfmadd231ps_fma(auVar226,auVar191,auVar20);
      fVar147 = auVar9._0_4_;
      fVar141 = auVar9._4_4_;
      auVar41._4_4_ = fVar141 * auVar22._4_4_;
      auVar41._0_4_ = fVar147 * auVar22._0_4_;
      fVar142 = auVar9._8_4_;
      auVar41._8_4_ = fVar142 * auVar22._8_4_;
      fVar143 = auVar9._12_4_;
      auVar41._12_4_ = fVar143 * auVar22._12_4_;
      auVar41._16_4_ = auVar22._16_4_ * 0.0;
      auVar41._20_4_ = auVar22._20_4_ * 0.0;
      auVar41._24_4_ = auVar22._24_4_ * 0.0;
      auVar41._28_4_ = 0xbf000000;
      auVar42._4_4_ = fVar141 * -auVar198._4_4_;
      auVar42._0_4_ = fVar147 * -auVar198._0_4_;
      auVar42._8_4_ = fVar142 * -auVar198._8_4_;
      auVar42._12_4_ = fVar143 * -auVar198._12_4_;
      auVar42._16_4_ = -auVar198._16_4_ * 0.0;
      auVar42._20_4_ = -auVar198._20_4_ * 0.0;
      auVar42._24_4_ = -auVar198._24_4_ * 0.0;
      auVar42._28_4_ = auVar8._4_4_;
      auVar43._28_4_ = auVar20._28_4_;
      auVar43._0_28_ =
           ZEXT1628(CONCAT412(fVar143 * 0.0,
                              CONCAT48(fVar142 * 0.0,CONCAT44(fVar141 * 0.0,fVar147 * 0.0))));
      auVar8 = vfmadd213ps_fma(auVar38,ZEXT1632(auVar10),auVar112);
      auVar198 = ZEXT1632(auVar10);
      auVar9 = vfmadd213ps_fma(auVar39,auVar198,auVar115);
      auVar12 = vfmadd213ps_fma(auVar40,auVar198,ZEXT1632(auVar173));
      auVar15 = vfnmadd213ps_fma(auVar38,auVar198,auVar112);
      auVar13 = vfmadd213ps_fma(auVar41,ZEXT1632(auVar11),local_300);
      auVar110 = vfnmadd213ps_fma(auVar39,auVar198,auVar115);
      auVar198 = ZEXT1632(auVar11);
      auVar14 = vfmadd213ps_fma(auVar42,auVar198,_local_320);
      local_4a0 = ZEXT1632(auVar10);
      auVar165 = vfnmadd231ps_fma(ZEXT1632(auVar173),local_4a0,auVar40);
      auVar10 = vfmadd213ps_fma(auVar43,auVar198,local_360);
      auVar125 = vfnmadd213ps_fma(auVar41,auVar198,local_300);
      auVar149 = vfnmadd213ps_fma(auVar42,auVar198,_local_320);
      local_4c0 = ZEXT1632(auVar11);
      auVar166 = vfnmadd231ps_fma(local_360,local_4c0,auVar43);
      auVar198 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar110));
      auVar20 = vsubps_avx(ZEXT1632(auVar10),ZEXT1632(auVar165));
      auVar44._4_4_ = auVar165._4_4_ * auVar198._4_4_;
      auVar44._0_4_ = auVar165._0_4_ * auVar198._0_4_;
      auVar44._8_4_ = auVar165._8_4_ * auVar198._8_4_;
      auVar44._12_4_ = auVar165._12_4_ * auVar198._12_4_;
      auVar44._16_4_ = auVar198._16_4_ * 0.0;
      auVar44._20_4_ = auVar198._20_4_ * 0.0;
      auVar44._24_4_ = auVar198._24_4_ * 0.0;
      auVar44._28_4_ = 0;
      auVar11 = vfmsub231ps_fma(auVar44,ZEXT1632(auVar110),auVar20);
      auVar45._4_4_ = auVar20._4_4_ * auVar15._4_4_;
      auVar45._0_4_ = auVar20._0_4_ * auVar15._0_4_;
      auVar45._8_4_ = auVar20._8_4_ * auVar15._8_4_;
      auVar45._12_4_ = auVar20._12_4_ * auVar15._12_4_;
      auVar45._16_4_ = auVar20._16_4_ * 0.0;
      auVar45._20_4_ = auVar20._20_4_ * 0.0;
      auVar45._24_4_ = auVar20._24_4_ * 0.0;
      auVar45._28_4_ = auVar20._28_4_;
      auVar20 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar15));
      auVar173 = vfmsub231ps_fma(auVar45,ZEXT1632(auVar165),auVar20);
      auVar46._4_4_ = auVar110._4_4_ * auVar20._4_4_;
      auVar46._0_4_ = auVar110._0_4_ * auVar20._0_4_;
      auVar46._8_4_ = auVar110._8_4_ * auVar20._8_4_;
      auVar46._12_4_ = auVar110._12_4_ * auVar20._12_4_;
      auVar46._16_4_ = auVar20._16_4_ * 0.0;
      auVar46._20_4_ = auVar20._20_4_ * 0.0;
      auVar46._24_4_ = auVar20._24_4_ * 0.0;
      auVar46._28_4_ = auVar20._28_4_;
      auVar161 = ZEXT1632(auVar15);
      auVar15 = vfmsub231ps_fma(auVar46,auVar161,auVar198);
      auVar173 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar173));
      auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),ZEXT832(0) << 0x20,ZEXT1632(auVar11));
      auVar160 = vcmpps_avx(ZEXT1632(auVar173),ZEXT832(0) << 0x20,2);
      local_600 = vblendvps_avx(ZEXT1632(auVar125),ZEXT1632(auVar8),auVar160);
      local_580 = vblendvps_avx(ZEXT1632(auVar149),ZEXT1632(auVar9),auVar160);
      auVar198 = vblendvps_avx(ZEXT1632(auVar166),ZEXT1632(auVar12),auVar160);
      auVar20 = vblendvps_avx(auVar161,ZEXT1632(auVar13),auVar160);
      auVar121 = vblendvps_avx(ZEXT1632(auVar110),ZEXT1632(auVar14),auVar160);
      auVar163 = vblendvps_avx(ZEXT1632(auVar165),ZEXT1632(auVar10),auVar160);
      auVar161 = vblendvps_avx(ZEXT1632(auVar13),auVar161,auVar160);
      auVar22 = vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar110),auVar160);
      auVar173 = vpackssdw_avx(auVar21._0_16_,auVar21._16_16_);
      local_7e0 = ZEXT1632(auVar173);
      auVar120 = vblendvps_avx(ZEXT1632(auVar10),ZEXT1632(auVar165),auVar160);
      auVar21 = vsubps_avx(auVar161,local_600);
      auVar22 = vsubps_avx(auVar22,local_580);
      auVar115 = vsubps_avx(auVar120,auVar198);
      auVar229 = ZEXT3264(auVar115);
      auVar112 = vsubps_avx(local_600,auVar20);
      auVar113 = vsubps_avx(local_580,auVar121);
      auVar126 = vsubps_avx(auVar198,auVar163);
      auVar232 = ZEXT3264(auVar126);
      auVar47._4_4_ = auVar115._4_4_ * local_600._4_4_;
      auVar47._0_4_ = auVar115._0_4_ * local_600._0_4_;
      auVar47._8_4_ = auVar115._8_4_ * local_600._8_4_;
      auVar47._12_4_ = auVar115._12_4_ * local_600._12_4_;
      auVar47._16_4_ = auVar115._16_4_ * local_600._16_4_;
      auVar47._20_4_ = auVar115._20_4_ * local_600._20_4_;
      auVar47._24_4_ = auVar115._24_4_ * local_600._24_4_;
      auVar47._28_4_ = auVar120._28_4_;
      auVar8 = vfmsub231ps_fma(auVar47,auVar198,auVar21);
      auVar48._4_4_ = auVar21._4_4_ * local_580._4_4_;
      auVar48._0_4_ = auVar21._0_4_ * local_580._0_4_;
      auVar48._8_4_ = auVar21._8_4_ * local_580._8_4_;
      auVar48._12_4_ = auVar21._12_4_ * local_580._12_4_;
      auVar48._16_4_ = auVar21._16_4_ * local_580._16_4_;
      auVar48._20_4_ = auVar21._20_4_ * local_580._20_4_;
      auVar48._24_4_ = auVar21._24_4_ * local_580._24_4_;
      auVar48._28_4_ = auVar161._28_4_;
      auVar9 = vfmsub231ps_fma(auVar48,local_600,auVar22);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT1632((undefined1  [16])0x0),ZEXT1632(auVar8));
      auVar117._0_4_ = auVar198._0_4_ * auVar22._0_4_;
      auVar117._4_4_ = auVar198._4_4_ * auVar22._4_4_;
      auVar117._8_4_ = auVar198._8_4_ * auVar22._8_4_;
      auVar117._12_4_ = auVar198._12_4_ * auVar22._12_4_;
      auVar117._16_4_ = auVar198._16_4_ * auVar22._16_4_;
      auVar117._20_4_ = auVar198._20_4_ * auVar22._20_4_;
      auVar117._24_4_ = auVar198._24_4_ * auVar22._24_4_;
      auVar117._28_4_ = 0;
      auVar9 = vfmsub231ps_fma(auVar117,local_580,auVar115);
      auVar9 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632((undefined1  [16])0x0),ZEXT1632(auVar9));
      auVar118._0_4_ = auVar126._0_4_ * auVar20._0_4_;
      auVar118._4_4_ = auVar126._4_4_ * auVar20._4_4_;
      auVar118._8_4_ = auVar126._8_4_ * auVar20._8_4_;
      auVar118._12_4_ = auVar126._12_4_ * auVar20._12_4_;
      auVar118._16_4_ = auVar126._16_4_ * auVar20._16_4_;
      auVar118._20_4_ = auVar126._20_4_ * auVar20._20_4_;
      auVar118._24_4_ = auVar126._24_4_ * auVar20._24_4_;
      auVar118._28_4_ = 0;
      auVar8 = vfmsub231ps_fma(auVar118,auVar112,auVar163);
      auVar130._0_4_ = auVar113._0_4_ * auVar163._0_4_;
      auVar130._4_4_ = auVar113._4_4_ * auVar163._4_4_;
      auVar130._8_4_ = auVar113._8_4_ * auVar163._8_4_;
      auVar130._12_4_ = auVar113._12_4_ * auVar163._12_4_;
      auVar130._16_4_ = auVar113._16_4_ * auVar163._16_4_;
      auVar130._20_4_ = auVar113._20_4_ * auVar163._20_4_;
      auVar130._24_4_ = auVar113._24_4_ * auVar163._24_4_;
      auVar130._28_4_ = 0;
      auVar10 = vfmsub231ps_fma(auVar130,auVar121,auVar126);
      auVar49._4_4_ = auVar112._4_4_ * auVar121._4_4_;
      auVar49._0_4_ = auVar112._0_4_ * auVar121._0_4_;
      auVar49._8_4_ = auVar112._8_4_ * auVar121._8_4_;
      auVar49._12_4_ = auVar112._12_4_ * auVar121._12_4_;
      auVar49._16_4_ = auVar112._16_4_ * auVar121._16_4_;
      auVar49._20_4_ = auVar112._20_4_ * auVar121._20_4_;
      auVar49._24_4_ = auVar112._24_4_ * auVar121._24_4_;
      auVar49._28_4_ = auVar121._28_4_;
      auVar11 = vfmsub231ps_fma(auVar49,auVar113,auVar20);
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
      auVar10 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar10));
      auVar121 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
      auVar121 = vcmpps_avx(auVar121,ZEXT832(0) << 0x20,2);
      auVar8 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
      auVar173 = vpand_avx(auVar8,auVar173);
      auVar121 = vpmovsxwd_avx2(auVar173);
      if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar121 >> 0x7f,0) == '\0') &&
            (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar121 >> 0xbf,0) == '\0') &&
          (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar121[0x1f]) {
        auVar181._8_8_ = local_520[1]._8_8_;
        auVar181._0_8_ = local_520[1]._0_8_;
        auVar181._16_8_ = local_520[1]._16_8_;
        auVar181._24_8_ = local_520[1]._24_8_;
      }
      else {
        auVar131._0_4_ = auVar126._0_4_ * auVar22._0_4_;
        auVar131._4_4_ = auVar126._4_4_ * auVar22._4_4_;
        auVar131._8_4_ = auVar126._8_4_ * auVar22._8_4_;
        auVar131._12_4_ = auVar126._12_4_ * auVar22._12_4_;
        auVar131._16_4_ = auVar126._16_4_ * auVar22._16_4_;
        auVar131._20_4_ = auVar126._20_4_ * auVar22._20_4_;
        auVar131._24_4_ = auVar126._24_4_ * auVar22._24_4_;
        auVar131._28_4_ = 0;
        auVar13 = vfmsub231ps_fma(auVar131,auVar113,auVar115);
        auVar50._4_4_ = auVar115._4_4_ * auVar112._4_4_;
        auVar50._0_4_ = auVar115._0_4_ * auVar112._0_4_;
        auVar50._8_4_ = auVar115._8_4_ * auVar112._8_4_;
        auVar50._12_4_ = auVar115._12_4_ * auVar112._12_4_;
        auVar50._16_4_ = auVar115._16_4_ * auVar112._16_4_;
        auVar50._20_4_ = auVar115._20_4_ * auVar112._20_4_;
        auVar50._24_4_ = auVar115._24_4_ * auVar112._24_4_;
        auVar50._28_4_ = auVar20._28_4_;
        auVar12 = vfmsub231ps_fma(auVar50,auVar21,auVar126);
        auVar51._4_4_ = auVar21._4_4_ * auVar113._4_4_;
        auVar51._0_4_ = auVar21._0_4_ * auVar113._0_4_;
        auVar51._8_4_ = auVar21._8_4_ * auVar113._8_4_;
        auVar51._12_4_ = auVar21._12_4_ * auVar113._12_4_;
        auVar51._16_4_ = auVar21._16_4_ * auVar113._16_4_;
        auVar51._20_4_ = auVar21._20_4_ * auVar113._20_4_;
        auVar51._24_4_ = auVar21._24_4_ * auVar113._24_4_;
        auVar51._28_4_ = auVar21._28_4_;
        auVar14 = vfmsub231ps_fma(auVar51,auVar112,auVar22);
        auVar8 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar12),ZEXT1632(auVar14));
        auVar11 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar13),_DAT_01f7b000);
        auVar20 = vrcpps_avx(ZEXT1632(auVar11));
        auVar222._8_4_ = 0x3f800000;
        auVar222._0_8_ = 0x3f8000003f800000;
        auVar222._12_4_ = 0x3f800000;
        auVar222._16_4_ = 0x3f800000;
        auVar222._20_4_ = 0x3f800000;
        auVar222._24_4_ = 0x3f800000;
        auVar222._28_4_ = 0x3f800000;
        auVar8 = vfnmadd213ps_fma(auVar20,ZEXT1632(auVar11),auVar222);
        auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar20,auVar20);
        auVar52._4_4_ = auVar14._4_4_ * auVar198._4_4_;
        auVar52._0_4_ = auVar14._0_4_ * auVar198._0_4_;
        auVar52._8_4_ = auVar14._8_4_ * auVar198._8_4_;
        auVar52._12_4_ = auVar14._12_4_ * auVar198._12_4_;
        auVar52._16_4_ = auVar198._16_4_ * 0.0;
        auVar52._20_4_ = auVar198._20_4_ * 0.0;
        auVar52._24_4_ = auVar198._24_4_ * 0.0;
        auVar52._28_4_ = auVar198._28_4_;
        auVar12 = vfmadd231ps_fma(auVar52,ZEXT1632(auVar12),local_580);
        auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar13),local_600);
        fVar141 = auVar8._0_4_;
        fVar142 = auVar8._4_4_;
        fVar143 = auVar8._8_4_;
        fVar144 = auVar8._12_4_;
        auVar53._28_4_ = auVar22._28_4_;
        auVar53._0_28_ =
             ZEXT1628(CONCAT412(fVar144 * auVar12._12_4_,
                                CONCAT48(fVar143 * auVar12._8_4_,
                                         CONCAT44(fVar142 * auVar12._4_4_,fVar141 * auVar12._0_4_)))
                     );
        auVar132._8_8_ = uVar109;
        auVar132._0_8_ = uVar109;
        auVar132._16_8_ = uVar109;
        auVar132._24_8_ = uVar109;
        fVar147 = (local_7f0->super_RayK<1>).tfar;
        auVar180._4_4_ = fVar147;
        auVar180._0_4_ = fVar147;
        auVar180._8_4_ = fVar147;
        auVar180._12_4_ = fVar147;
        auVar180._16_4_ = fVar147;
        auVar180._20_4_ = fVar147;
        auVar180._24_4_ = fVar147;
        auVar180._28_4_ = fVar147;
        auVar198 = vcmpps_avx(auVar132,auVar53,2);
        auVar20 = vcmpps_avx(auVar53,auVar180,2);
        auVar198 = vandps_avx(auVar20,auVar198);
        auVar8 = vpackssdw_avx(auVar198._0_16_,auVar198._16_16_);
        auVar173 = vpand_avx(auVar173,auVar8);
        auVar198 = vpmovsxwd_avx2(auVar173);
        if ((((((((auVar198 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar198 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar198 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar198 >> 0x7f,0) == '\0') &&
              (auVar198 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar198 >> 0xbf,0) == '\0') &&
            (auVar198 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar198[0x1f]) {
          auVar181._8_8_ = local_520[1]._8_8_;
          auVar181._0_8_ = local_520[1]._0_8_;
          auVar181._16_8_ = local_520[1]._16_8_;
          auVar181._24_8_ = local_520[1]._24_8_;
        }
        else {
          auVar198 = vcmpps_avx(ZEXT1632(auVar11),_DAT_01f7b000,4);
          auVar8 = vpackssdw_avx(auVar198._0_16_,auVar198._16_16_);
          auVar173 = vpand_avx(auVar173,auVar8);
          auVar198 = vpmovsxwd_avx2(auVar173);
          auVar181._8_8_ = local_520[1]._8_8_;
          auVar181._0_8_ = local_520[1]._0_8_;
          auVar181._16_8_ = local_520[1]._16_8_;
          auVar181._24_8_ = local_520[1]._24_8_;
          if ((((((((auVar198 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar198 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar198 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar198 >> 0x7f,0) != '\0') ||
                (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar198 >> 0xbf,0) != '\0') ||
              (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar198[0x1f] < '\0') {
            auVar121 = ZEXT1632(CONCAT412(fVar144 * auVar9._12_4_,
                                          CONCAT48(fVar143 * auVar9._8_4_,
                                                   CONCAT44(fVar142 * auVar9._4_4_,
                                                            fVar141 * auVar9._0_4_))));
            auVar163 = ZEXT1632(CONCAT412(fVar144 * auVar10._12_4_,
                                          CONCAT48(fVar143 * auVar10._8_4_,
                                                   CONCAT44(fVar142 * auVar10._4_4_,
                                                            fVar141 * auVar10._0_4_))));
            auVar192._8_4_ = 0x3f800000;
            auVar192._0_8_ = 0x3f8000003f800000;
            auVar192._12_4_ = 0x3f800000;
            auVar192._16_4_ = 0x3f800000;
            auVar192._20_4_ = 0x3f800000;
            auVar192._24_4_ = 0x3f800000;
            auVar192._28_4_ = 0x3f800000;
            auVar20 = vsubps_avx(auVar192,auVar121);
            _local_180 = vblendvps_avx(auVar20,auVar121,auVar160);
            auVar20 = vsubps_avx(auVar192,auVar163);
            local_3a0 = vblendvps_avx(auVar20,auVar163,auVar160);
            local_380 = auVar53;
            auVar181 = auVar198;
          }
        }
      }
      auVar239 = ZEXT3264(local_6e0);
      auVar220 = ZEXT3264(local_780);
      auVar218 = ZEXT3264(local_6c0);
      if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar181 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar181 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar181 >> 0x7f,0) != '\0') ||
            (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar181 >> 0xbf,0) != '\0') ||
          (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar181[0x1f] < '\0') {
        auVar198 = vsubps_avx(local_4c0,local_4a0);
        auVar173 = vfmadd213ps_fma(auVar198,_local_180,local_4a0);
        fVar147 = local_718->depth_scale;
        auVar54._4_4_ = (auVar173._4_4_ + auVar173._4_4_) * fVar147;
        auVar54._0_4_ = (auVar173._0_4_ + auVar173._0_4_) * fVar147;
        auVar54._8_4_ = (auVar173._8_4_ + auVar173._8_4_) * fVar147;
        auVar54._12_4_ = (auVar173._12_4_ + auVar173._12_4_) * fVar147;
        auVar54._16_4_ = fVar147 * 0.0;
        auVar54._20_4_ = fVar147 * 0.0;
        auVar54._24_4_ = fVar147 * 0.0;
        auVar54._28_4_ = 0;
        auVar198 = vcmpps_avx(local_380,auVar54,6);
        auVar20 = auVar181 & auVar198;
        if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar20 >> 0x7f,0) != '\0') ||
              (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar20 >> 0xbf,0) != '\0') ||
            (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar20[0x1f] < '\0') {
          auVar133._8_4_ = 0xbf800000;
          auVar133._0_8_ = 0xbf800000bf800000;
          auVar133._12_4_ = 0xbf800000;
          auVar133._16_4_ = 0xbf800000;
          auVar133._20_4_ = 0xbf800000;
          auVar133._24_4_ = 0xbf800000;
          auVar133._28_4_ = 0xbf800000;
          auVar162._8_4_ = 0x40000000;
          auVar162._0_8_ = 0x4000000040000000;
          auVar162._12_4_ = 0x40000000;
          auVar162._16_4_ = 0x40000000;
          auVar162._20_4_ = 0x40000000;
          auVar162._24_4_ = 0x40000000;
          auVar162._28_4_ = 0x40000000;
          auVar173 = vfmadd213ps_fma(local_3a0,auVar162,auVar133);
          local_2e0 = _local_180;
          local_3a0 = ZEXT1632(auVar173);
          auVar20 = local_3a0;
          local_2c0 = ZEXT1632(auVar173);
          local_2a0 = local_380;
          local_280 = 0;
          local_27c = iVar17;
          local_270 = local_730._0_8_;
          uStack_268 = local_730._8_8_;
          local_260 = local_740._0_8_;
          uStack_258 = local_740._8_8_;
          local_250 = local_750._0_8_;
          uStack_248 = local_750._8_8_;
          local_240 = local_760;
          uStack_238 = uStack_758;
          _local_760 = auVar194;
          local_750 = auVar111;
          local_740 = auVar148;
          local_730 = auVar189;
          local_3a0 = auVar20;
          if ((pGVar106->mask & (local_7f0->super_RayK<1>).mask) != 0) {
            auVar198 = vandps_avx(auVar198,auVar181);
            local_520[0] = auVar198;
            fVar147 = 1.0 / auVar129._0_4_;
            local_200[0] = fVar147 * ((float)local_180._0_4_ + 0.0);
            local_200[1] = fVar147 * ((float)local_180._4_4_ + 1.0);
            local_200[2] = fVar147 * (fStack_178 + 2.0);
            local_200[3] = fVar147 * (fStack_174 + 3.0);
            fStack_1f0 = fVar147 * (fStack_170 + 4.0);
            fStack_1ec = fVar147 * (fStack_16c + 5.0);
            fStack_1e8 = fVar147 * (fStack_168 + 6.0);
            fStack_1e4 = fStack_164 + 7.0;
            local_3a0._0_8_ = auVar173._0_8_;
            local_3a0._8_8_ = auVar173._8_8_;
            local_1e0 = local_3a0._0_8_;
            uStack_1d8 = local_3a0._8_8_;
            uStack_1d0 = 0;
            uStack_1c8 = 0;
            local_1c0 = local_380;
            auVar134._8_4_ = 0x7f800000;
            auVar134._0_8_ = 0x7f8000007f800000;
            auVar134._12_4_ = 0x7f800000;
            auVar134._16_4_ = 0x7f800000;
            auVar134._20_4_ = 0x7f800000;
            auVar134._24_4_ = 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar20 = vblendvps_avx(auVar134,local_380,auVar198);
            auVar121 = vshufps_avx(auVar20,auVar20,0xb1);
            auVar121 = vminps_avx(auVar20,auVar121);
            auVar163 = vshufpd_avx(auVar121,auVar121,5);
            auVar121 = vminps_avx(auVar121,auVar163);
            auVar163 = vpermpd_avx2(auVar121,0x4e);
            auVar121 = vminps_avx(auVar121,auVar163);
            auVar20 = vcmpps_avx(auVar20,auVar121,0);
            auVar121 = auVar198 & auVar20;
            if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar121 >> 0x7f,0) != '\0') ||
                  (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0xbf,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar121[0x1f] < '\0') {
              auVar198 = vandps_avx(auVar20,auVar198);
            }
            uVar98 = vmovmskps_avx(auVar198);
            uVar23 = 0;
            for (; (uVar98 & 1) == 0; uVar98 = uVar98 >> 1 | 0x80000000) {
              uVar23 = uVar23 + 1;
            }
            uVar108 = (ulong)uVar23;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar106->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_7e0 = ZEXT432((uint)(local_7f0->super_RayK<1>).tfar);
              _local_440 = auVar215;
              do {
                local_644 = local_200[uVar108];
                local_640 = *(undefined4 *)((long)&local_1e0 + uVar108 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar108 * 4);
                local_710.context = context->user;
                fVar147 = 1.0 - local_644;
                auVar173 = ZEXT416((uint)(local_644 * fVar147 * 4.0));
                auVar8 = vfnmsub213ss_fma(ZEXT416((uint)local_644),ZEXT416((uint)local_644),auVar173
                                         );
                auVar173 = vfmadd213ss_fma(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),auVar173);
                fVar147 = fVar147 * -fVar147 * 0.5;
                fVar141 = auVar8._0_4_ * 0.5;
                fVar142 = auVar173._0_4_ * 0.5;
                fVar143 = local_644 * local_644 * 0.5;
                auVar178._0_4_ = fVar143 * (float)local_760._0_4_;
                auVar178._4_4_ = fVar143 * (float)local_760._4_4_;
                auVar178._8_4_ = fVar143 * (float)uStack_758;
                auVar178._12_4_ = fVar143 * uStack_758._4_4_;
                auVar156._4_4_ = fVar142;
                auVar156._0_4_ = fVar142;
                auVar156._8_4_ = fVar142;
                auVar156._12_4_ = fVar142;
                auVar173 = vfmadd132ps_fma(auVar156,auVar178,local_750);
                auVar179._4_4_ = fVar141;
                auVar179._0_4_ = fVar141;
                auVar179._8_4_ = fVar141;
                auVar179._12_4_ = fVar141;
                auVar173 = vfmadd132ps_fma(auVar179,auVar173,local_740);
                auVar157._4_4_ = fVar147;
                auVar157._0_4_ = fVar147;
                auVar157._8_4_ = fVar147;
                auVar157._12_4_ = fVar147;
                auVar173 = vfmadd132ps_fma(auVar157,auVar173,local_730);
                local_650 = vmovlps_avx(auVar173);
                local_648 = vextractps_avx(auVar173,2);
                local_63c = (int)local_7a8;
                local_638 = (int)local_7e8;
                local_634 = (local_710.context)->instID[0];
                local_630 = (local_710.context)->instPrimID[0];
                local_7f4 = -1;
                local_710.valid = &local_7f4;
                local_710.geometryUserPtr = pGVar106->userPtr;
                local_710.ray = (RTCRayN *)ray;
                local_710.hit = (RTCHitN *)&local_650;
                local_710.N = 1;
                if (pGVar106->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01404c22:
                  p_Var19 = context->args->filter;
                  if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((pGVar106->field_8).field_0x2 & 0x40) != 0)))) {
                    auVar229 = ZEXT1664(auVar229._0_16_);
                    auVar232 = ZEXT1664(auVar232._0_16_);
                    (*p_Var19)(&local_710);
                    auVar220 = ZEXT3264(local_780);
                    auVar218 = ZEXT3264(local_6c0);
                    auVar239 = ZEXT3264(local_6e0);
                    ray = local_7f0;
                    uVar109 = local_7a0._0_8_;
                    uVar124 = local_680;
                    uVar235 = uStack_678;
                    uVar236 = uStack_670;
                    uVar237 = uStack_668;
                    if (*local_710.valid == 0) goto LAB_01404ce2;
                  }
                  (((Vec3f *)((long)local_710.ray + 0x30))->field_0).components[0] =
                       *(float *)local_710.hit;
                  (((Vec3f *)((long)local_710.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_710.hit + 4);
                  (((Vec3f *)((long)local_710.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_710.hit + 8);
                  *(float *)((long)local_710.ray + 0x3c) = *(float *)(local_710.hit + 0xc);
                  *(float *)((long)local_710.ray + 0x40) = *(float *)(local_710.hit + 0x10);
                  *(float *)((long)local_710.ray + 0x44) = *(float *)(local_710.hit + 0x14);
                  *(float *)((long)local_710.ray + 0x48) = *(float *)(local_710.hit + 0x18);
                  *(float *)((long)local_710.ray + 0x4c) = *(float *)(local_710.hit + 0x1c);
                  *(float *)((long)local_710.ray + 0x50) = *(float *)(local_710.hit + 0x20);
                }
                else {
                  auVar229 = ZEXT1664(auVar229._0_16_);
                  auVar232 = ZEXT1664(auVar232._0_16_);
                  (*pGVar106->intersectionFilterN)(&local_710);
                  auVar220 = ZEXT3264(local_780);
                  auVar218 = ZEXT3264(local_6c0);
                  auVar239 = ZEXT3264(local_6e0);
                  ray = local_7f0;
                  uVar109 = local_7a0._0_8_;
                  uVar124 = local_680;
                  uVar235 = uStack_678;
                  uVar236 = uStack_670;
                  uVar237 = uStack_668;
                  if (*local_710.valid != 0) goto LAB_01404c22;
LAB_01404ce2:
                  (local_7f0->super_RayK<1>).tfar = (float)local_7e0._0_4_;
                  ray = local_7f0;
                  uVar109 = local_7a0._0_8_;
                  uVar124 = local_680;
                  uVar235 = uStack_678;
                  uVar236 = uStack_670;
                  uVar237 = uStack_668;
                }
                *(undefined4 *)(local_520[0] + uVar108 * 4) = 0;
                auVar121 = local_520[0];
                fVar147 = (ray->super_RayK<1>).tfar;
                auVar123._4_4_ = fVar147;
                auVar123._0_4_ = fVar147;
                auVar123._8_4_ = fVar147;
                auVar123._12_4_ = fVar147;
                auVar123._16_4_ = fVar147;
                auVar123._20_4_ = fVar147;
                auVar123._24_4_ = fVar147;
                auVar123._28_4_ = fVar147;
                auVar20 = vcmpps_avx(local_380,auVar123,2);
                auVar198 = vandps_avx(auVar20,local_520[0]);
                local_520[0] = auVar198;
                auVar121 = auVar121 & auVar20;
                prim = local_720;
                if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar121 >> 0x7f,0) == '\0') &&
                      (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar121 >> 0xbf,0) == '\0') &&
                    (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar121[0x1f]) goto LAB_01403b4f;
                auVar139._8_4_ = 0x7f800000;
                auVar139._0_8_ = 0x7f8000007f800000;
                auVar139._12_4_ = 0x7f800000;
                auVar139._16_4_ = 0x7f800000;
                auVar139._20_4_ = 0x7f800000;
                auVar139._24_4_ = 0x7f800000;
                auVar139._28_4_ = 0x7f800000;
                auVar20 = vblendvps_avx(auVar139,local_380,auVar198);
                auVar121 = vshufps_avx(auVar20,auVar20,0xb1);
                auVar121 = vminps_avx(auVar20,auVar121);
                auVar163 = vshufpd_avx(auVar121,auVar121,5);
                auVar121 = vminps_avx(auVar121,auVar163);
                auVar163 = vpermpd_avx2(auVar121,0x4e);
                auVar121 = vminps_avx(auVar121,auVar163);
                auVar20 = vcmpps_avx(auVar20,auVar121,0);
                auVar121 = auVar198 & auVar20;
                if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar121 >> 0x7f,0) != '\0') ||
                      (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar121 >> 0xbf,0) != '\0') ||
                    (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar121[0x1f] < '\0') {
                  auVar198 = vandps_avx(auVar20,auVar198);
                }
                local_7e0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                uVar99 = vmovmskps_avx(auVar198);
                uVar101 = 0;
                for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                  uVar101 = uVar101 + 1;
                }
                uVar108 = (ulong)uVar101;
              } while( true );
            }
            fVar147 = local_200[uVar108];
            fVar141 = *(float *)((long)&local_1e0 + uVar108 * 4);
            fVar142 = 1.0 - fVar147;
            auVar173 = ZEXT416((uint)(fVar147 * fVar142 * 4.0));
            auVar8 = vfnmsub213ss_fma(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),auVar173);
            auVar173 = vfmadd213ss_fma(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142),auVar173);
            fVar142 = fVar142 * -fVar142 * 0.5;
            fVar143 = auVar8._0_4_ * 0.5;
            fVar144 = auVar173._0_4_ * 0.5;
            fVar145 = fVar147 * fVar147 * 0.5;
            auVar171._0_4_ = fVar145 * (float)local_760._0_4_;
            auVar171._4_4_ = fVar145 * (float)local_760._4_4_;
            auVar171._8_4_ = fVar145 * (float)uStack_758;
            auVar171._12_4_ = fVar145 * uStack_758._4_4_;
            auVar150._4_4_ = fVar144;
            auVar150._0_4_ = fVar144;
            auVar150._8_4_ = fVar144;
            auVar150._12_4_ = fVar144;
            auVar173 = vfmadd132ps_fma(auVar150,auVar171,local_750);
            auVar172._4_4_ = fVar143;
            auVar172._0_4_ = fVar143;
            auVar172._8_4_ = fVar143;
            auVar172._12_4_ = fVar143;
            auVar173 = vfmadd132ps_fma(auVar172,auVar173,local_740);
            auVar151._4_4_ = fVar142;
            auVar151._0_4_ = fVar142;
            auVar151._8_4_ = fVar142;
            auVar151._12_4_ = fVar142;
            auVar173 = vfmadd132ps_fma(auVar151,auVar173,local_730);
            (local_7f0->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar108 * 4);
            uVar4 = vmovlps_avx(auVar173);
            *(undefined8 *)&(local_7f0->Ng).field_0 = uVar4;
            fVar142 = (float)vextractps_avx(auVar173,2);
            (local_7f0->Ng).field_0.field_0.z = fVar142;
            local_7f0->u = fVar147;
            local_7f0->v = fVar141;
            local_7f0->primID = uVar99;
            local_7f0->geomID = uVar101;
            local_7f0->instID[0] = context->user->instID[0];
            local_7f0->instPrimID[0] = context->user->instPrimID[0];
            prim = local_720;
          }
LAB_01403b4f:
          auVar140 = ZEXT3264(local_5e0);
          auVar169 = ZEXT3264(local_540);
          goto LAB_0140387a;
        }
      }
      auVar140 = ZEXT3264(local_5e0);
      auVar169 = ZEXT3264(local_540);
    }
LAB_0140387a:
    if (8 < iVar17) {
      local_4e0._4_4_ = iVar17;
      local_4e0._0_4_ = iVar17;
      local_4e0._8_4_ = iVar17;
      local_4e0._12_4_ = iVar17;
      local_4e0._16_4_ = iVar17;
      local_4e0._20_4_ = iVar17;
      local_4e0._24_4_ = iVar17;
      local_4e0._28_4_ = iVar17;
      local_120 = local_620._0_4_;
      uStack_11c = local_620._0_4_;
      uStack_118 = local_620._0_4_;
      uStack_114 = local_620._0_4_;
      uStack_110 = local_620._0_4_;
      uStack_10c = local_620._0_4_;
      uStack_108 = local_620._0_4_;
      uStack_104 = local_620._0_4_;
      local_140 = uVar109;
      uStack_138 = uVar109;
      uStack_130 = uVar109;
      uStack_128 = uVar109;
      local_160 = 1.0 / (float)local_460._0_4_;
      fStack_15c = local_160;
      fStack_158 = local_160;
      fStack_154 = local_160;
      fStack_150 = local_160;
      fStack_14c = local_160;
      fStack_148 = local_160;
      fStack_144 = local_160;
      lVar103 = 8;
      uStack_678 = uVar235;
      local_680 = uVar124;
      uStack_670 = uVar236;
      uStack_668 = uVar237;
      lVar105 = local_7b0;
      fVar147 = (float)local_5a0;
      fVar141 = local_5a0._4_4_;
      fVar142 = (float)uStack_598;
      fVar143 = uStack_598._4_4_;
      fVar144 = (float)uStack_590;
      fVar145 = uStack_590._4_4_;
      fVar146 = (float)uStack_588;
      uVar107 = uStack_588._4_4_;
LAB_01403be5:
      local_5e0 = auVar140._0_32_;
      if (lVar103 < lVar105) {
        local_7a0 = *(undefined1 (*) [32])(bspline_basis0 + lVar103 * 4 + lVar102);
        auVar198 = *(undefined1 (*) [32])(lVar102 + 0x21fffac + lVar103 * 4);
        auVar20 = *(undefined1 (*) [32])(lVar102 + 0x2200430 + lVar103 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar102 + 0x22008b4 + lVar103 * 4);
        fVar219 = *(float *)*pauVar2;
        fVar200 = *(float *)(*pauVar2 + 4);
        fVar206 = *(float *)(*pauVar2 + 8);
        fVar208 = *(float *)(*pauVar2 + 0xc);
        fVar210 = *(float *)(*pauVar2 + 0x10);
        fVar199 = *(float *)(*pauVar2 + 0x14);
        fVar205 = *(float *)(*pauVar2 + 0x18);
        auVar96 = *(undefined1 (*) [28])*pauVar2;
        auVar233._0_4_ = fVar219 * local_5c0;
        auVar233._4_4_ = fVar200 * fStack_5bc;
        auVar233._8_4_ = fVar206 * fStack_5b8;
        auVar233._12_4_ = fVar208 * fStack_5b4;
        auVar233._16_4_ = fVar210 * fStack_5b0;
        auVar233._20_4_ = fVar199 * fStack_5ac;
        auVar233._28_36_ = auVar232._28_36_;
        auVar233._24_4_ = fVar205 * fStack_5a8;
        auVar230._0_4_ = fVar219 * fVar147;
        auVar230._4_4_ = fVar200 * fVar141;
        auVar230._8_4_ = fVar206 * fVar142;
        auVar230._12_4_ = fVar208 * fVar143;
        auVar230._16_4_ = fVar210 * fVar144;
        auVar230._20_4_ = fVar199 * fVar145;
        auVar230._28_36_ = auVar229._28_36_;
        auVar230._24_4_ = fVar205 * fVar146;
        auVar173 = vfmadd231ps_fma(auVar233._0_32_,auVar20,auVar169._0_32_);
        auVar115 = auVar239._0_32_;
        auVar8 = vfmadd231ps_fma(auVar230._0_32_,auVar20,auVar115);
        auVar215 = auVar218._0_32_;
        auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),auVar198,auVar215);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar198,local_420);
        auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),local_7a0,auVar220._0_32_);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),local_7a0,local_400);
        auVar121 = *(undefined1 (*) [32])(bspline_basis1 + lVar103 * 4 + lVar102);
        auVar163 = *(undefined1 (*) [32])(lVar102 + 0x22023cc + lVar103 * 4);
        auVar161 = *(undefined1 (*) [32])(lVar102 + 0x2202850 + lVar103 * 4);
        pauVar3 = (undefined1 (*) [32])(lVar102 + 0x2202cd4 + lVar103 * 4);
        fVar207 = *(float *)*pauVar3;
        fVar209 = *(float *)(*pauVar3 + 4);
        fVar211 = *(float *)(*pauVar3 + 8);
        fVar212 = *(float *)(*pauVar3 + 0xc);
        fVar213 = *(float *)(*pauVar3 + 0x10);
        fVar224 = *(float *)(*pauVar3 + 0x14);
        fVar231 = *(float *)(*pauVar3 + 0x18);
        auVar97 = *(undefined1 (*) [28])*pauVar3;
        _local_620 = *pauVar3;
        auVar55._4_4_ = fStack_5bc * fVar209;
        auVar55._0_4_ = local_5c0 * fVar207;
        auVar55._8_4_ = fStack_5b8 * fVar211;
        auVar55._12_4_ = fStack_5b4 * fVar212;
        auVar55._16_4_ = fStack_5b0 * fVar213;
        auVar55._20_4_ = fStack_5ac * fVar224;
        auVar55._24_4_ = fStack_5a8 * fVar231;
        auVar55._28_4_ = local_7a0._28_4_;
        auVar56._4_4_ = fVar141 * fVar209;
        auVar56._0_4_ = fVar147 * fVar207;
        auVar56._8_4_ = fVar142 * fVar211;
        auVar56._12_4_ = fVar143 * fVar212;
        auVar56._16_4_ = fVar144 * fVar213;
        auVar56._20_4_ = fVar145 * fVar224;
        auVar56._24_4_ = fVar146 * fVar231;
        auVar56._28_4_ = fStack_5a4;
        auVar9 = vfmadd231ps_fma(auVar55,auVar161,auVar169._0_32_);
        auVar10 = vfmadd231ps_fma(auVar56,auVar161,auVar115);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar163,auVar215);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar163,local_420);
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar121,auVar220._0_32_);
        auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar121,local_400);
        local_4a0 = ZEXT1632(auVar9);
        local_4c0 = ZEXT1632(auVar173);
        local_360 = vsubps_avx(local_4a0,local_4c0);
        local_580 = ZEXT1632(auVar10);
        local_300 = ZEXT1632(auVar8);
        local_340 = vsubps_avx(local_580,local_300);
        auVar57._4_4_ = auVar8._4_4_ * local_360._4_4_;
        auVar57._0_4_ = auVar8._0_4_ * local_360._0_4_;
        auVar57._8_4_ = auVar8._8_4_ * local_360._8_4_;
        auVar57._12_4_ = auVar8._12_4_ * local_360._12_4_;
        auVar57._16_4_ = local_360._16_4_ * 0.0;
        auVar57._20_4_ = local_360._20_4_ * 0.0;
        auVar57._24_4_ = local_360._24_4_ * 0.0;
        auVar57._28_4_ = uVar107;
        auVar229 = ZEXT3264(auVar20);
        fVar147 = local_340._0_4_;
        auVar135._0_4_ = auVar173._0_4_ * fVar147;
        fVar141 = local_340._4_4_;
        auVar135._4_4_ = auVar173._4_4_ * fVar141;
        fVar142 = local_340._8_4_;
        auVar135._8_4_ = auVar173._8_4_ * fVar142;
        fVar143 = local_340._12_4_;
        auVar135._12_4_ = auVar173._12_4_ * fVar143;
        fVar144 = local_340._16_4_;
        auVar135._16_4_ = fVar144 * 0.0;
        fVar145 = local_340._20_4_;
        auVar135._20_4_ = fVar145 * 0.0;
        fVar146 = local_340._24_4_;
        auVar135._24_4_ = fVar146 * 0.0;
        auVar135._28_4_ = 0;
        auVar120 = vsubps_avx(auVar57,auVar135);
        _local_320 = *pauVar2;
        auVar160 = _local_320;
        auVar58._4_4_ = local_100._4_4_ * fVar200;
        auVar58._0_4_ = (float)local_100 * fVar219;
        auVar58._8_4_ = (float)uStack_f8 * fVar206;
        auVar58._12_4_ = uStack_f8._4_4_ * fVar208;
        auVar58._16_4_ = (float)uStack_f0 * fVar210;
        auVar58._20_4_ = uStack_f0._4_4_ * fVar199;
        auVar58._24_4_ = (float)uStack_e8 * fVar205;
        auVar58._28_4_ = 0;
        auVar173 = vfmadd231ps_fma(auVar58,auVar20,local_e0);
        auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),local_c0,auVar198);
        auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),local_a0,local_7a0);
        auVar59._4_4_ = local_100._4_4_ * fVar209;
        auVar59._0_4_ = (float)local_100 * fVar207;
        auVar59._8_4_ = (float)uStack_f8 * fVar211;
        auVar59._12_4_ = uStack_f8._4_4_ * fVar212;
        auVar59._16_4_ = (float)uStack_f0 * fVar213;
        auVar59._20_4_ = uStack_f0._4_4_ * fVar224;
        auVar59._24_4_ = (float)uStack_e8 * fVar231;
        auVar59._28_4_ = uStack_e8._4_4_;
        auVar8 = vfmadd231ps_fma(auVar59,auVar161,local_e0);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar163,local_c0);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar121,local_a0);
        auVar232 = ZEXT1664(auVar8);
        auVar220._0_4_ = fVar147 * fVar147;
        auVar220._4_4_ = fVar141 * fVar141;
        auVar220._8_4_ = fVar142 * fVar142;
        auVar220._12_4_ = fVar143 * fVar143;
        auVar220._16_4_ = fVar144 * fVar144;
        auVar220._20_4_ = fVar145 * fVar145;
        auVar220._28_36_ = auVar218._28_36_;
        auVar220._24_4_ = fVar146 * fVar146;
        auVar9 = vfmadd231ps_fma(auVar220._0_32_,local_360,local_360);
        _local_440 = ZEXT1632(auVar173);
        local_600 = ZEXT1632(auVar8);
        auVar22 = vmaxps_avx(_local_440,local_600);
        auVar216._0_4_ = auVar22._0_4_ * auVar22._0_4_ * auVar9._0_4_;
        auVar216._4_4_ = auVar22._4_4_ * auVar22._4_4_ * auVar9._4_4_;
        auVar216._8_4_ = auVar22._8_4_ * auVar22._8_4_ * auVar9._8_4_;
        auVar216._12_4_ = auVar22._12_4_ * auVar22._12_4_ * auVar9._12_4_;
        auVar216._16_4_ = auVar22._16_4_ * auVar22._16_4_ * 0.0;
        auVar216._20_4_ = auVar22._20_4_ * auVar22._20_4_ * 0.0;
        auVar216._24_4_ = auVar22._24_4_ * auVar22._24_4_ * 0.0;
        auVar216._28_4_ = 0;
        auVar60._4_4_ = auVar120._4_4_ * auVar120._4_4_;
        auVar60._0_4_ = auVar120._0_4_ * auVar120._0_4_;
        auVar60._8_4_ = auVar120._8_4_ * auVar120._8_4_;
        auVar60._12_4_ = auVar120._12_4_ * auVar120._12_4_;
        auVar60._16_4_ = auVar120._16_4_ * auVar120._16_4_;
        auVar60._20_4_ = auVar120._20_4_ * auVar120._20_4_;
        auVar60._24_4_ = auVar120._24_4_ * auVar120._24_4_;
        auVar60._28_4_ = auVar120._28_4_;
        auVar22 = vcmpps_avx(auVar60,auVar216,2);
        local_280 = (int)lVar103;
        auVar217._4_4_ = local_280;
        auVar217._0_4_ = local_280;
        auVar217._8_4_ = local_280;
        auVar217._12_4_ = local_280;
        auVar217._16_4_ = local_280;
        auVar217._20_4_ = local_280;
        auVar217._24_4_ = local_280;
        auVar217._28_4_ = local_280;
        auVar120 = vpor_avx2(auVar217,_DAT_01fb4ba0);
        auVar21 = vpcmpgtd_avx2(local_4e0,auVar120);
        auVar120 = auVar21 & auVar22;
        fVar147 = (float)local_5a0;
        fVar141 = local_5a0._4_4_;
        fVar142 = (float)uStack_598;
        fVar143 = uStack_598._4_4_;
        fVar144 = (float)uStack_590;
        fVar145 = uStack_590._4_4_;
        fVar146 = (float)uStack_588;
        uVar107 = uStack_588._4_4_;
        if ((((((((auVar120 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar120 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar120 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar120 >> 0x7f,0) != '\0') ||
              (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar120 >> 0xbf,0) != '\0') ||
            (auVar120 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar120[0x1f] < '\0') {
          _local_460 = vandps_avx(auVar21,auVar22);
          local_620._0_4_ = auVar97._0_4_;
          local_620._4_4_ = auVar97._4_4_;
          fStack_618 = auVar97._8_4_;
          fStack_614 = auVar97._12_4_;
          fStack_610 = auVar97._16_4_;
          fStack_60c = auVar97._20_4_;
          fStack_608 = auVar97._24_4_;
          auVar61._4_4_ = local_680._4_4_ * (float)local_620._4_4_;
          auVar61._0_4_ = (float)local_680 * (float)local_620._0_4_;
          auVar61._8_4_ = (float)uStack_678 * fStack_618;
          auVar61._12_4_ = uStack_678._4_4_ * fStack_614;
          auVar61._16_4_ = (float)uStack_670 * fStack_610;
          auVar61._20_4_ = uStack_670._4_4_ * fStack_60c;
          auVar61._24_4_ = (float)uStack_668 * fStack_608;
          auVar61._28_4_ = auVar22._28_4_;
          auVar93._8_8_ = uStack_478;
          auVar93._0_8_ = local_480;
          auVar93._16_8_ = uStack_470;
          auVar93._24_8_ = uStack_468;
          auVar173 = vfmadd213ps_fma(auVar161,auVar93,auVar61);
          auVar173 = vfmadd213ps_fma(auVar163,local_6a0,ZEXT1632(auVar173));
          auVar89._4_4_ = uStack_55c;
          auVar89._0_4_ = local_560;
          auVar89._8_8_ = uStack_558;
          auVar89._16_8_ = uStack_550;
          auVar89._24_8_ = uStack_548;
          auVar173 = vfmadd213ps_fma(auVar121,auVar89,ZEXT1632(auVar173));
          local_320._0_4_ = auVar96._0_4_;
          local_320._4_4_ = auVar96._4_4_;
          fStack_318 = auVar96._8_4_;
          fStack_314 = auVar96._12_4_;
          fStack_310 = auVar96._16_4_;
          fStack_30c = auVar96._20_4_;
          fStack_308 = auVar96._24_4_;
          auVar62._4_4_ = local_680._4_4_ * (float)local_320._4_4_;
          auVar62._0_4_ = (float)local_680 * (float)local_320._0_4_;
          auVar62._8_4_ = (float)uStack_678 * fStack_318;
          auVar62._12_4_ = uStack_678._4_4_ * fStack_314;
          auVar62._16_4_ = (float)uStack_670 * fStack_310;
          auVar62._20_4_ = uStack_670._4_4_ * fStack_30c;
          auVar62._24_4_ = (float)uStack_668 * fStack_308;
          auVar62._28_4_ = auVar22._28_4_;
          auVar8 = vfmadd213ps_fma(auVar20,auVar93,auVar62);
          auVar8 = vfmadd213ps_fma(auVar198,local_6a0,ZEXT1632(auVar8));
          auVar198 = *(undefined1 (*) [32])(lVar102 + 0x2200d38 + lVar103 * 4);
          auVar20 = *(undefined1 (*) [32])(lVar102 + 0x22011bc + lVar103 * 4);
          auVar121 = *(undefined1 (*) [32])(lVar102 + 0x2201640 + lVar103 * 4);
          pfVar1 = (float *)(lVar102 + 0x2201ac4 + lVar103 * 4);
          fVar219 = *pfVar1;
          fVar200 = pfVar1[1];
          fVar206 = pfVar1[2];
          fVar208 = pfVar1[3];
          fVar210 = pfVar1[4];
          fVar199 = pfVar1[5];
          fVar205 = pfVar1[6];
          auVar203._0_4_ = fVar219 * local_5c0;
          auVar203._4_4_ = fVar200 * fStack_5bc;
          auVar203._8_4_ = fVar206 * fStack_5b8;
          auVar203._12_4_ = fVar208 * fStack_5b4;
          auVar203._16_4_ = fVar210 * fStack_5b0;
          auVar203._20_4_ = fVar199 * fStack_5ac;
          auVar203._24_4_ = fVar205 * fStack_5a8;
          auVar203._28_4_ = 0;
          auVar227._0_4_ = fVar219 * (float)local_5a0;
          auVar227._4_4_ = fVar200 * local_5a0._4_4_;
          auVar227._8_4_ = fVar206 * (float)uStack_598;
          auVar227._12_4_ = fVar208 * uStack_598._4_4_;
          auVar227._16_4_ = fVar210 * (float)uStack_590;
          auVar227._20_4_ = fVar199 * uStack_590._4_4_;
          auVar227._24_4_ = fVar205 * (float)uStack_588;
          auVar227._28_4_ = 0;
          auVar63._4_4_ = local_680._4_4_ * fVar200;
          auVar63._0_4_ = (float)local_680 * fVar219;
          auVar63._8_4_ = (float)uStack_678 * fVar206;
          auVar63._12_4_ = uStack_678._4_4_ * fVar208;
          auVar63._16_4_ = (float)uStack_670 * fVar210;
          auVar63._20_4_ = uStack_670._4_4_ * fVar199;
          auVar63._24_4_ = (float)uStack_668 * fVar205;
          auVar63._28_4_ = pfVar1[7];
          auVar9 = vfmadd231ps_fma(auVar203,auVar121,local_540);
          auVar10 = vfmadd231ps_fma(auVar227,auVar121,auVar115);
          auVar11 = vfmadd231ps_fma(auVar63,auVar93,auVar121);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar20,auVar215);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar20,local_420);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),local_6a0,auVar20);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar198,local_780);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar198,local_400);
          auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar89,auVar198);
          pfVar1 = (float *)(lVar102 + 0x2203ee4 + lVar103 * 4);
          fVar219 = *pfVar1;
          fVar200 = pfVar1[1];
          fVar206 = pfVar1[2];
          fVar208 = pfVar1[3];
          fVar210 = pfVar1[4];
          fVar199 = pfVar1[5];
          fVar205 = pfVar1[6];
          auVar64._4_4_ = fStack_5bc * fVar200;
          auVar64._0_4_ = local_5c0 * fVar219;
          auVar64._8_4_ = fStack_5b8 * fVar206;
          auVar64._12_4_ = fStack_5b4 * fVar208;
          auVar64._16_4_ = fStack_5b0 * fVar210;
          auVar64._20_4_ = fStack_5ac * fVar199;
          auVar64._24_4_ = fStack_5a8 * fVar205;
          auVar64._28_4_ = uStack_668._4_4_;
          auVar65._4_4_ = local_5a0._4_4_ * fVar200;
          auVar65._0_4_ = (float)local_5a0 * fVar219;
          auVar65._8_4_ = (float)uStack_598 * fVar206;
          auVar65._12_4_ = uStack_598._4_4_ * fVar208;
          auVar65._16_4_ = (float)uStack_590 * fVar210;
          auVar65._20_4_ = uStack_590._4_4_ * fVar199;
          auVar65._24_4_ = (float)uStack_588 * fVar205;
          auVar65._28_4_ = (int)((ulong)uStack_548 >> 0x20);
          auVar66._4_4_ = fVar200 * local_680._4_4_;
          auVar66._0_4_ = fVar219 * (float)local_680;
          auVar66._8_4_ = fVar206 * (float)uStack_678;
          auVar66._12_4_ = fVar208 * uStack_678._4_4_;
          auVar66._16_4_ = fVar210 * (float)uStack_670;
          auVar66._20_4_ = fVar199 * uStack_670._4_4_;
          auVar66._24_4_ = fVar205 * (float)uStack_668;
          auVar66._28_4_ = pfVar1[7];
          auVar198 = *(undefined1 (*) [32])(lVar102 + 0x2203a60 + lVar103 * 4);
          auVar12 = vfmadd231ps_fma(auVar64,auVar198,local_540);
          auVar13 = vfmadd231ps_fma(auVar65,auVar198,auVar115);
          auVar14 = vfmadd231ps_fma(auVar66,auVar93,auVar198);
          auVar198 = *(undefined1 (*) [32])(lVar102 + 0x22035dc + lVar103 * 4);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar198,auVar215);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar198,local_420);
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar198,local_6a0);
          auVar198 = *(undefined1 (*) [32])(lVar102 + 0x2203158 + lVar103 * 4);
          auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar198,local_780);
          auVar13 = vfmadd231ps_fma(ZEXT1632(auVar13),auVar198,local_400);
          auVar90._4_4_ = uStack_55c;
          auVar90._0_4_ = local_560;
          auVar90._8_8_ = uStack_558;
          auVar90._16_8_ = uStack_550;
          auVar90._24_8_ = uStack_548;
          auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar90,auVar198);
          auVar198 = vandps_avx(ZEXT1632(auVar9),local_1a0);
          auVar20 = vandps_avx(ZEXT1632(auVar10),local_1a0);
          auVar20 = vmaxps_avx(auVar198,auVar20);
          auVar198 = vandps_avx(ZEXT1632(auVar11),local_1a0);
          auVar198 = vmaxps_avx(auVar20,auVar198);
          auVar95._4_4_ = uStack_11c;
          auVar95._0_4_ = local_120;
          auVar95._8_4_ = uStack_118;
          auVar95._12_4_ = uStack_114;
          auVar95._16_4_ = uStack_110;
          auVar95._20_4_ = uStack_10c;
          auVar95._24_4_ = uStack_108;
          auVar95._28_4_ = uStack_104;
          auVar198 = vcmpps_avx(auVar198,auVar95,1);
          auVar121 = vblendvps_avx(ZEXT1632(auVar9),local_360,auVar198);
          auVar163 = vblendvps_avx(ZEXT1632(auVar10),local_340,auVar198);
          auVar198 = vandps_avx(ZEXT1632(auVar12),local_1a0);
          auVar20 = vandps_avx(ZEXT1632(auVar13),local_1a0);
          auVar20 = vmaxps_avx(auVar198,auVar20);
          auVar198 = vandps_avx(local_1a0,ZEXT1632(auVar14));
          auVar198 = vmaxps_avx(auVar20,auVar198);
          auVar20 = vcmpps_avx(auVar198,auVar95,1);
          auVar198 = vblendvps_avx(ZEXT1632(auVar12),local_360,auVar20);
          auVar20 = vblendvps_avx(ZEXT1632(auVar13),local_340,auVar20);
          auVar8 = vfmadd213ps_fma(local_7a0,auVar90,ZEXT1632(auVar8));
          auVar9 = vfmadd213ps_fma(auVar121,auVar121,ZEXT832(0) << 0x20);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar163,auVar163);
          auVar161 = vrsqrtps_avx(ZEXT1632(auVar9));
          fVar219 = auVar161._0_4_;
          fVar200 = auVar161._4_4_;
          fVar206 = auVar161._8_4_;
          fVar208 = auVar161._12_4_;
          fVar210 = auVar161._16_4_;
          fVar199 = auVar161._20_4_;
          fVar205 = auVar161._24_4_;
          auVar67._4_4_ = fVar200 * fVar200 * fVar200 * auVar9._4_4_ * -0.5;
          auVar67._0_4_ = fVar219 * fVar219 * fVar219 * auVar9._0_4_ * -0.5;
          auVar67._8_4_ = fVar206 * fVar206 * fVar206 * auVar9._8_4_ * -0.5;
          auVar67._12_4_ = fVar208 * fVar208 * fVar208 * auVar9._12_4_ * -0.5;
          auVar67._16_4_ = fVar210 * fVar210 * fVar210 * -0.0;
          auVar67._20_4_ = fVar199 * fVar199 * fVar199 * -0.0;
          auVar67._24_4_ = fVar205 * fVar205 * fVar205 * -0.0;
          auVar67._28_4_ = 0;
          auVar182._8_4_ = 0x3fc00000;
          auVar182._0_8_ = 0x3fc000003fc00000;
          auVar182._12_4_ = 0x3fc00000;
          auVar182._16_4_ = 0x3fc00000;
          auVar182._20_4_ = 0x3fc00000;
          auVar182._24_4_ = 0x3fc00000;
          auVar182._28_4_ = 0x3fc00000;
          auVar9 = vfmadd231ps_fma(auVar67,auVar182,auVar161);
          fVar219 = auVar9._0_4_;
          fVar200 = auVar9._4_4_;
          auVar68._4_4_ = auVar163._4_4_ * fVar200;
          auVar68._0_4_ = auVar163._0_4_ * fVar219;
          fVar206 = auVar9._8_4_;
          auVar68._8_4_ = auVar163._8_4_ * fVar206;
          fVar208 = auVar9._12_4_;
          auVar68._12_4_ = auVar163._12_4_ * fVar208;
          auVar68._16_4_ = auVar163._16_4_ * 0.0;
          auVar68._20_4_ = auVar163._20_4_ * 0.0;
          auVar68._24_4_ = auVar163._24_4_ * 0.0;
          auVar68._28_4_ = auVar163._28_4_;
          auVar69._4_4_ = fVar200 * -auVar121._4_4_;
          auVar69._0_4_ = fVar219 * -auVar121._0_4_;
          auVar69._8_4_ = fVar206 * -auVar121._8_4_;
          auVar69._12_4_ = fVar208 * -auVar121._12_4_;
          auVar69._16_4_ = -auVar121._16_4_ * 0.0;
          auVar69._20_4_ = -auVar121._20_4_ * 0.0;
          auVar69._24_4_ = -auVar121._24_4_ * 0.0;
          auVar69._28_4_ = auVar161._28_4_;
          auVar9 = vfmadd213ps_fma(auVar198,auVar198,ZEXT832(0) << 0x20);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar20,auVar20);
          auVar121 = vrsqrtps_avx(ZEXT1632(auVar9));
          auVar70._28_4_ = auVar218._28_4_;
          auVar70._0_28_ =
               ZEXT1628(CONCAT412(fVar208 * 0.0,
                                  CONCAT48(fVar206 * 0.0,CONCAT44(fVar200 * 0.0,fVar219 * 0.0))));
          fVar219 = auVar121._0_4_;
          fVar200 = auVar121._4_4_;
          fVar206 = auVar121._8_4_;
          fVar208 = auVar121._12_4_;
          fVar210 = auVar121._16_4_;
          fVar199 = auVar121._20_4_;
          fVar205 = auVar121._24_4_;
          auVar71._4_4_ = fVar200 * fVar200 * fVar200 * auVar9._4_4_ * -0.5;
          auVar71._0_4_ = fVar219 * fVar219 * fVar219 * auVar9._0_4_ * -0.5;
          auVar71._8_4_ = fVar206 * fVar206 * fVar206 * auVar9._8_4_ * -0.5;
          auVar71._12_4_ = fVar208 * fVar208 * fVar208 * auVar9._12_4_ * -0.5;
          auVar71._16_4_ = fVar210 * fVar210 * fVar210 * -0.0;
          auVar71._20_4_ = fVar199 * fVar199 * fVar199 * -0.0;
          auVar71._24_4_ = fVar205 * fVar205 * fVar205 * -0.0;
          auVar71._28_4_ = 0;
          auVar9 = vfmadd231ps_fma(auVar71,auVar182,auVar121);
          fVar219 = auVar9._0_4_;
          fVar200 = auVar9._4_4_;
          auVar72._4_4_ = auVar20._4_4_ * fVar200;
          auVar72._0_4_ = auVar20._0_4_ * fVar219;
          fVar206 = auVar9._8_4_;
          auVar72._8_4_ = auVar20._8_4_ * fVar206;
          fVar208 = auVar9._12_4_;
          auVar72._12_4_ = auVar20._12_4_ * fVar208;
          auVar72._16_4_ = auVar20._16_4_ * 0.0;
          auVar72._20_4_ = auVar20._20_4_ * 0.0;
          auVar72._24_4_ = auVar20._24_4_ * 0.0;
          auVar72._28_4_ = 0;
          auVar73._4_4_ = fVar200 * -auVar198._4_4_;
          auVar73._0_4_ = fVar219 * -auVar198._0_4_;
          auVar73._8_4_ = fVar206 * -auVar198._8_4_;
          auVar73._12_4_ = fVar208 * -auVar198._12_4_;
          auVar73._16_4_ = -auVar198._16_4_ * 0.0;
          auVar73._20_4_ = -auVar198._20_4_ * 0.0;
          auVar73._24_4_ = -auVar198._24_4_ * 0.0;
          auVar73._28_4_ = 0;
          auVar74._28_4_ = 0xbf000000;
          auVar74._0_28_ =
               ZEXT1628(CONCAT412(fVar208 * 0.0,
                                  CONCAT48(fVar206 * 0.0,CONCAT44(fVar200 * 0.0,fVar219 * 0.0))));
          auVar9 = vfmadd213ps_fma(auVar68,_local_440,local_4c0);
          auVar10 = vfmadd213ps_fma(auVar69,_local_440,local_300);
          auVar11 = vfmadd213ps_fma(auVar70,_local_440,ZEXT1632(auVar8));
          auVar15 = vfnmadd213ps_fma(auVar68,_local_440,local_4c0);
          auVar12 = vfmadd213ps_fma(auVar72,local_600,local_4a0);
          auVar110 = vfnmadd213ps_fma(auVar69,_local_440,local_300);
          auVar13 = vfmadd213ps_fma(auVar73,local_600,local_580);
          auVar148 = vfnmadd231ps_fma(ZEXT1632(auVar8),_local_440,auVar70);
          auVar8 = vfmadd213ps_fma(auVar74,local_600,ZEXT1632(auVar173));
          auVar194 = vfnmadd213ps_fma(auVar72,local_600,local_4a0);
          auVar111 = vfnmadd213ps_fma(auVar73,local_600,local_580);
          auVar189 = vfnmadd231ps_fma(ZEXT1632(auVar173),local_600,auVar74);
          auVar198 = vsubps_avx(ZEXT1632(auVar13),ZEXT1632(auVar110));
          auVar20 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar148));
          auVar75._4_4_ = auVar198._4_4_ * auVar148._4_4_;
          auVar75._0_4_ = auVar198._0_4_ * auVar148._0_4_;
          auVar75._8_4_ = auVar198._8_4_ * auVar148._8_4_;
          auVar75._12_4_ = auVar198._12_4_ * auVar148._12_4_;
          auVar75._16_4_ = auVar198._16_4_ * 0.0;
          auVar75._20_4_ = auVar198._20_4_ * 0.0;
          auVar75._24_4_ = auVar198._24_4_ * 0.0;
          auVar75._28_4_ = 0;
          auVar14 = vfmsub231ps_fma(auVar75,ZEXT1632(auVar110),auVar20);
          auVar76._4_4_ = auVar15._4_4_ * auVar20._4_4_;
          auVar76._0_4_ = auVar15._0_4_ * auVar20._0_4_;
          auVar76._8_4_ = auVar15._8_4_ * auVar20._8_4_;
          auVar76._12_4_ = auVar15._12_4_ * auVar20._12_4_;
          auVar76._16_4_ = auVar20._16_4_ * 0.0;
          auVar76._20_4_ = auVar20._20_4_ * 0.0;
          auVar76._24_4_ = auVar20._24_4_ * 0.0;
          auVar76._28_4_ = auVar20._28_4_;
          auVar161 = ZEXT1632(auVar15);
          auVar20 = vsubps_avx(ZEXT1632(auVar12),auVar161);
          auVar120 = ZEXT1632(auVar148);
          auVar173 = vfmsub231ps_fma(auVar76,auVar120,auVar20);
          auVar77._4_4_ = auVar110._4_4_ * auVar20._4_4_;
          auVar77._0_4_ = auVar110._0_4_ * auVar20._0_4_;
          auVar77._8_4_ = auVar110._8_4_ * auVar20._8_4_;
          auVar77._12_4_ = auVar110._12_4_ * auVar20._12_4_;
          auVar77._16_4_ = auVar20._16_4_ * 0.0;
          auVar77._20_4_ = auVar20._20_4_ * 0.0;
          auVar77._24_4_ = auVar20._24_4_ * 0.0;
          auVar77._28_4_ = auVar20._28_4_;
          auVar15 = vfmsub231ps_fma(auVar77,auVar161,auVar198);
          auVar173 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar173));
          auVar173 = vfmadd231ps_fma(ZEXT1632(auVar173),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
          auVar21 = vcmpps_avx(ZEXT1632(auVar173),ZEXT832(0) << 0x20,2);
          auVar198 = vblendvps_avx(ZEXT1632(auVar194),ZEXT1632(auVar9),auVar21);
          local_7a0 = vblendvps_avx(ZEXT1632(auVar111),ZEXT1632(auVar10),auVar21);
          _local_620 = vblendvps_avx(ZEXT1632(auVar189),ZEXT1632(auVar11),auVar21);
          auVar20 = vblendvps_avx(auVar161,ZEXT1632(auVar12),auVar21);
          auVar121 = vblendvps_avx(ZEXT1632(auVar110),ZEXT1632(auVar13),auVar21);
          auVar163 = vblendvps_avx(auVar120,ZEXT1632(auVar8),auVar21);
          auVar161 = vblendvps_avx(ZEXT1632(auVar12),auVar161,auVar21);
          auVar22 = vblendvps_avx(ZEXT1632(auVar13),ZEXT1632(auVar110),auVar21);
          auVar173 = vpackssdw_avx(local_460._0_16_,local_460._16_16_);
          local_7e0 = ZEXT1632(auVar173);
          auVar120 = vblendvps_avx(ZEXT1632(auVar8),auVar120,auVar21);
          auVar161 = vsubps_avx(auVar161,auVar198);
          auVar22 = vsubps_avx(auVar22,local_7a0);
          auVar215 = vsubps_avx(auVar120,_local_620);
          auVar229 = ZEXT3264(auVar215);
          auVar115 = vsubps_avx(auVar198,auVar20);
          auVar112 = vsubps_avx(local_7a0,auVar121);
          auVar113 = vsubps_avx(_local_620,auVar163);
          auVar232 = ZEXT3264(auVar113);
          auVar186._0_4_ = auVar215._0_4_ * auVar198._0_4_;
          auVar186._4_4_ = auVar215._4_4_ * auVar198._4_4_;
          auVar186._8_4_ = auVar215._8_4_ * auVar198._8_4_;
          auVar186._12_4_ = auVar215._12_4_ * auVar198._12_4_;
          auVar186._16_4_ = auVar215._16_4_ * auVar198._16_4_;
          auVar186._20_4_ = auVar215._20_4_ * auVar198._20_4_;
          auVar186._24_4_ = auVar215._24_4_ * auVar198._24_4_;
          auVar186._28_4_ = 0;
          auVar8 = vfmsub231ps_fma(auVar186,_local_620,auVar161);
          auVar78._4_4_ = auVar161._4_4_ * local_7a0._4_4_;
          auVar78._0_4_ = auVar161._0_4_ * local_7a0._0_4_;
          auVar78._8_4_ = auVar161._8_4_ * local_7a0._8_4_;
          auVar78._12_4_ = auVar161._12_4_ * local_7a0._12_4_;
          auVar78._16_4_ = auVar161._16_4_ * local_7a0._16_4_;
          auVar78._20_4_ = auVar161._20_4_ * local_7a0._20_4_;
          auVar78._24_4_ = auVar161._24_4_ * local_7a0._24_4_;
          auVar78._28_4_ = auVar120._28_4_;
          auVar9 = vfmsub231ps_fma(auVar78,auVar198,auVar22);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
          auVar187._0_4_ = auVar22._0_4_ * local_620._0_4_;
          auVar187._4_4_ = auVar22._4_4_ * local_620._4_4_;
          auVar187._8_4_ = auVar22._8_4_ * local_620._8_4_;
          auVar187._12_4_ = auVar22._12_4_ * local_620._12_4_;
          auVar187._16_4_ = auVar22._16_4_ * local_620._16_4_;
          auVar187._20_4_ = auVar22._20_4_ * local_620._20_4_;
          auVar187._24_4_ = auVar22._24_4_ * local_620._24_4_;
          auVar187._28_4_ = 0;
          auVar9 = vfmsub231ps_fma(auVar187,local_7a0,auVar215);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
          auVar188._0_4_ = auVar113._0_4_ * auVar20._0_4_;
          auVar188._4_4_ = auVar113._4_4_ * auVar20._4_4_;
          auVar188._8_4_ = auVar113._8_4_ * auVar20._8_4_;
          auVar188._12_4_ = auVar113._12_4_ * auVar20._12_4_;
          auVar188._16_4_ = auVar113._16_4_ * auVar20._16_4_;
          auVar188._20_4_ = auVar113._20_4_ * auVar20._20_4_;
          auVar188._24_4_ = auVar113._24_4_ * auVar20._24_4_;
          auVar188._28_4_ = 0;
          auVar8 = vfmsub231ps_fma(auVar188,auVar115,auVar163);
          auVar79._4_4_ = auVar112._4_4_ * auVar163._4_4_;
          auVar79._0_4_ = auVar112._0_4_ * auVar163._0_4_;
          auVar79._8_4_ = auVar112._8_4_ * auVar163._8_4_;
          auVar79._12_4_ = auVar112._12_4_ * auVar163._12_4_;
          auVar79._16_4_ = auVar112._16_4_ * auVar163._16_4_;
          auVar79._20_4_ = auVar112._20_4_ * auVar163._20_4_;
          auVar79._24_4_ = auVar112._24_4_ * auVar163._24_4_;
          auVar79._28_4_ = auVar163._28_4_;
          auVar10 = vfmsub231ps_fma(auVar79,auVar121,auVar113);
          auVar80._4_4_ = auVar115._4_4_ * auVar121._4_4_;
          auVar80._0_4_ = auVar115._0_4_ * auVar121._0_4_;
          auVar80._8_4_ = auVar115._8_4_ * auVar121._8_4_;
          auVar80._12_4_ = auVar115._12_4_ * auVar121._12_4_;
          auVar80._16_4_ = auVar115._16_4_ * auVar121._16_4_;
          auVar80._20_4_ = auVar115._20_4_ * auVar121._20_4_;
          auVar80._24_4_ = auVar115._24_4_ * auVar121._24_4_;
          auVar80._28_4_ = auVar121._28_4_;
          auVar11 = vfmsub231ps_fma(auVar80,auVar112,auVar20);
          auVar121 = ZEXT832(0) << 0x20;
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar121,ZEXT1632(auVar8));
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar121,ZEXT1632(auVar10));
          auVar20 = vmaxps_avx(ZEXT1632(auVar9),ZEXT1632(auVar10));
          auVar20 = vcmpps_avx(auVar20,auVar121,2);
          auVar8 = vpackssdw_avx(auVar20._0_16_,auVar20._16_16_);
          auVar173 = vpand_avx(auVar8,auVar173);
          auVar20 = vpmovsxwd_avx2(auVar173);
          if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar20 >> 0x7f,0) == '\0') &&
                (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar20 >> 0xbf,0) == '\0') &&
              (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar20[0x1f]) {
LAB_014046fb:
            auVar168._8_8_ = local_520[1]._8_8_;
            auVar168._0_8_ = local_520[1]._0_8_;
            auVar168._16_8_ = local_520[1]._16_8_;
            auVar168._24_8_ = local_520[1]._24_8_;
          }
          else {
            auVar81._4_4_ = auVar22._4_4_ * auVar113._4_4_;
            auVar81._0_4_ = auVar22._0_4_ * auVar113._0_4_;
            auVar81._8_4_ = auVar22._8_4_ * auVar113._8_4_;
            auVar81._12_4_ = auVar22._12_4_ * auVar113._12_4_;
            auVar81._16_4_ = auVar22._16_4_ * auVar113._16_4_;
            auVar81._20_4_ = auVar22._20_4_ * auVar113._20_4_;
            auVar81._24_4_ = auVar22._24_4_ * auVar113._24_4_;
            auVar81._28_4_ = auVar20._28_4_;
            auVar13 = vfmsub231ps_fma(auVar81,auVar112,auVar215);
            auVar193._0_4_ = auVar215._0_4_ * auVar115._0_4_;
            auVar193._4_4_ = auVar215._4_4_ * auVar115._4_4_;
            auVar193._8_4_ = auVar215._8_4_ * auVar115._8_4_;
            auVar193._12_4_ = auVar215._12_4_ * auVar115._12_4_;
            auVar193._16_4_ = auVar215._16_4_ * auVar115._16_4_;
            auVar193._20_4_ = auVar215._20_4_ * auVar115._20_4_;
            auVar193._24_4_ = auVar215._24_4_ * auVar115._24_4_;
            auVar193._28_4_ = 0;
            auVar12 = vfmsub231ps_fma(auVar193,auVar161,auVar113);
            auVar82._4_4_ = auVar161._4_4_ * auVar112._4_4_;
            auVar82._0_4_ = auVar161._0_4_ * auVar112._0_4_;
            auVar82._8_4_ = auVar161._8_4_ * auVar112._8_4_;
            auVar82._12_4_ = auVar161._12_4_ * auVar112._12_4_;
            auVar82._16_4_ = auVar161._16_4_ * auVar112._16_4_;
            auVar82._20_4_ = auVar161._20_4_ * auVar112._20_4_;
            auVar82._24_4_ = auVar161._24_4_ * auVar112._24_4_;
            auVar82._28_4_ = auVar112._28_4_;
            auVar14 = vfmsub231ps_fma(auVar82,auVar115,auVar22);
            auVar8 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar12),ZEXT1632(auVar14));
            auVar11 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar13),auVar121);
            auVar20 = vrcpps_avx(ZEXT1632(auVar11));
            auVar228._8_4_ = 0x3f800000;
            auVar228._0_8_ = 0x3f8000003f800000;
            auVar228._12_4_ = 0x3f800000;
            auVar228._16_4_ = 0x3f800000;
            auVar228._20_4_ = 0x3f800000;
            auVar228._24_4_ = 0x3f800000;
            auVar228._28_4_ = 0x3f800000;
            auVar229 = ZEXT3264(auVar228);
            auVar8 = vfnmadd213ps_fma(auVar20,ZEXT1632(auVar11),auVar228);
            auVar8 = vfmadd132ps_fma(ZEXT1632(auVar8),auVar20,auVar20);
            auVar83._4_4_ = auVar14._4_4_ * local_620._4_4_;
            auVar83._0_4_ = auVar14._0_4_ * local_620._0_4_;
            auVar83._8_4_ = auVar14._8_4_ * local_620._8_4_;
            auVar83._12_4_ = auVar14._12_4_ * local_620._12_4_;
            auVar83._16_4_ = local_620._16_4_ * 0.0;
            auVar83._20_4_ = local_620._20_4_ * 0.0;
            auVar83._24_4_ = local_620._24_4_ * 0.0;
            auVar83._28_4_ = local_7a0._28_4_;
            auVar12 = vfmadd231ps_fma(auVar83,ZEXT1632(auVar12),local_7a0);
            auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar198,ZEXT1632(auVar13));
            fVar200 = auVar8._0_4_;
            fVar206 = auVar8._4_4_;
            fVar208 = auVar8._8_4_;
            fVar210 = auVar8._12_4_;
            auVar121 = ZEXT1632(CONCAT412(fVar210 * auVar12._12_4_,
                                          CONCAT48(fVar208 * auVar12._8_4_,
                                                   CONCAT44(fVar206 * auVar12._4_4_,
                                                            fVar200 * auVar12._0_4_))));
            fVar219 = (ray->super_RayK<1>).tfar;
            auVar167._4_4_ = fVar219;
            auVar167._0_4_ = fVar219;
            auVar167._8_4_ = fVar219;
            auVar167._12_4_ = fVar219;
            auVar167._16_4_ = fVar219;
            auVar167._20_4_ = fVar219;
            auVar167._24_4_ = fVar219;
            auVar167._28_4_ = fVar219;
            auVar94._8_8_ = uStack_138;
            auVar94._0_8_ = local_140;
            auVar94._16_8_ = uStack_130;
            auVar94._24_8_ = uStack_128;
            auVar198 = vcmpps_avx(auVar94,auVar121,2);
            auVar20 = vcmpps_avx(auVar121,auVar167,2);
            auVar198 = vandps_avx(auVar20,auVar198);
            auVar8 = vpackssdw_avx(auVar198._0_16_,auVar198._16_16_);
            auVar173 = vpand_avx(auVar173,auVar8);
            auVar198 = vpmovsxwd_avx2(auVar173);
            if ((((((((auVar198 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar198 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar198 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar198 >> 0x7f,0) == '\0') &&
                  (auVar198 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar198 >> 0xbf,0) == '\0') &&
                (auVar198 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar198[0x1f]) goto LAB_014046fb;
            auVar198 = vcmpps_avx(ZEXT1632(auVar11),ZEXT832(0) << 0x20,4);
            auVar8 = vpackssdw_avx(auVar198._0_16_,auVar198._16_16_);
            auVar173 = vpand_avx(auVar173,auVar8);
            auVar198 = vpmovsxwd_avx2(auVar173);
            auVar168._8_8_ = local_520[1]._8_8_;
            auVar168._0_8_ = local_520[1]._0_8_;
            auVar168._16_8_ = local_520[1]._16_8_;
            auVar168._24_8_ = local_520[1]._24_8_;
            if ((((((((auVar198 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar198 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar198 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar198 >> 0x7f,0) != '\0') ||
                  (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar198 >> 0xbf,0) != '\0') ||
                (auVar198 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar198[0x1f] < '\0') {
              auVar163 = ZEXT1632(CONCAT412(fVar210 * auVar9._12_4_,
                                            CONCAT48(fVar208 * auVar9._8_4_,
                                                     CONCAT44(fVar206 * auVar9._4_4_,
                                                              fVar200 * auVar9._0_4_))));
              auVar84._28_4_ = SUB84(local_520[1]._24_8_,4);
              auVar84._0_28_ =
                   ZEXT1628(CONCAT412(fVar210 * auVar10._12_4_,
                                      CONCAT48(fVar208 * auVar10._8_4_,
                                               CONCAT44(fVar206 * auVar10._4_4_,
                                                        fVar200 * auVar10._0_4_))));
              auVar204._8_4_ = 0x3f800000;
              auVar204._0_8_ = 0x3f8000003f800000;
              auVar204._12_4_ = 0x3f800000;
              auVar204._16_4_ = 0x3f800000;
              auVar204._20_4_ = 0x3f800000;
              auVar204._24_4_ = 0x3f800000;
              auVar204._28_4_ = 0x3f800000;
              auVar20 = vsubps_avx(auVar204,auVar163);
              local_5e0 = vblendvps_avx(auVar20,auVar163,auVar21);
              auVar20 = vsubps_avx(auVar204,auVar84);
              local_3e0 = vblendvps_avx(auVar20,auVar84,auVar21);
              local_3c0 = auVar121;
              auVar168 = auVar198;
            }
          }
          auVar239 = ZEXT3264(local_6e0);
          auVar220 = ZEXT3264(local_780);
          auVar218 = ZEXT3264(local_6c0);
          if ((((((((auVar168 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar168 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar168 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar168 >> 0x7f,0) != '\0') ||
                (auVar168 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar168 >> 0xbf,0) != '\0') ||
              (auVar168 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar168[0x1f] < '\0') {
            auVar198 = vsubps_avx(local_600,_local_440);
            auVar173 = vfmadd213ps_fma(auVar198,local_5e0,_local_440);
            fVar219 = local_718->depth_scale;
            auVar85._4_4_ = (auVar173._4_4_ + auVar173._4_4_) * fVar219;
            auVar85._0_4_ = (auVar173._0_4_ + auVar173._0_4_) * fVar219;
            auVar85._8_4_ = (auVar173._8_4_ + auVar173._8_4_) * fVar219;
            auVar85._12_4_ = (auVar173._12_4_ + auVar173._12_4_) * fVar219;
            auVar85._16_4_ = fVar219 * 0.0;
            auVar85._20_4_ = fVar219 * 0.0;
            auVar85._24_4_ = fVar219 * 0.0;
            auVar85._28_4_ = fVar219;
            auVar198 = vcmpps_avx(local_3c0,auVar85,6);
            auVar20 = auVar168 & auVar198;
            if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar20 >> 0x7f,0) == '\0') &&
                  (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar20 >> 0xbf,0) == '\0') &&
                (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar20[0x1f]) {
              auVar140 = ZEXT3264(local_5e0);
              goto LAB_014046c5;
            }
            auVar136._8_4_ = 0xbf800000;
            auVar136._0_8_ = 0xbf800000bf800000;
            auVar136._12_4_ = 0xbf800000;
            auVar136._16_4_ = 0xbf800000;
            auVar136._20_4_ = 0xbf800000;
            auVar136._24_4_ = 0xbf800000;
            auVar136._28_4_ = 0xbf800000;
            auVar164._8_4_ = 0x40000000;
            auVar164._0_8_ = 0x4000000040000000;
            auVar164._12_4_ = 0x40000000;
            auVar164._16_4_ = 0x40000000;
            auVar164._20_4_ = 0x40000000;
            auVar164._24_4_ = 0x40000000;
            auVar164._28_4_ = 0x40000000;
            auVar173 = vfmadd213ps_fma(local_3e0,auVar164,auVar136);
            local_2e0 = local_5e0;
            local_3e0 = ZEXT1632(auVar173);
            auVar20 = local_3e0;
            local_2c0 = ZEXT1632(auVar173);
            local_2a0 = local_3c0;
            local_27c = iVar17;
            local_270 = local_730._0_8_;
            uStack_268 = local_730._8_8_;
            local_260 = local_740._0_8_;
            uStack_258 = local_740._8_8_;
            local_250 = local_750._0_8_;
            uStack_248 = local_750._8_8_;
            local_240 = local_760;
            uStack_238 = uStack_758;
            pGVar106 = (context->scene->geometries).items[local_7e8].ptr;
            auVar140 = ZEXT3264(local_5e0);
            if ((pGVar106->mask & (ray->super_RayK<1>).mask) == 0) goto LAB_014046d7;
            auVar198 = vandps_avx(auVar198,auVar168);
            local_520[0] = auVar198;
            fVar147 = (float)local_280;
            local_200[0] = (fVar147 + local_5e0._0_4_ + 0.0) * local_160;
            local_200[1] = (fVar147 + local_5e0._4_4_ + 1.0) * fStack_15c;
            local_200[2] = (fVar147 + local_5e0._8_4_ + 2.0) * fStack_158;
            local_200[3] = (fVar147 + local_5e0._12_4_ + 3.0) * fStack_154;
            fStack_1f0 = (fVar147 + local_5e0._16_4_ + 4.0) * fStack_150;
            fStack_1ec = (fVar147 + local_5e0._20_4_ + 5.0) * fStack_14c;
            fStack_1e8 = (fVar147 + local_5e0._24_4_ + 6.0) * fStack_148;
            fStack_1e4 = fVar147 + local_5e0._28_4_ + 7.0;
            local_3e0._0_8_ = auVar173._0_8_;
            local_3e0._8_8_ = auVar173._8_8_;
            local_1e0 = local_3e0._0_8_;
            uStack_1d8 = local_3e0._8_8_;
            uStack_1d0 = 0;
            uStack_1c8 = 0;
            local_1c0 = local_3c0;
            auVar137._8_4_ = 0x7f800000;
            auVar137._0_8_ = 0x7f8000007f800000;
            auVar137._12_4_ = 0x7f800000;
            auVar137._16_4_ = 0x7f800000;
            auVar137._20_4_ = 0x7f800000;
            auVar137._24_4_ = 0x7f800000;
            auVar137._28_4_ = 0x7f800000;
            auVar121 = vblendvps_avx(auVar137,local_3c0,auVar198);
            auVar163 = vshufps_avx(auVar121,auVar121,0xb1);
            auVar163 = vminps_avx(auVar121,auVar163);
            auVar161 = vshufpd_avx(auVar163,auVar163,5);
            auVar163 = vminps_avx(auVar163,auVar161);
            auVar161 = vpermpd_avx2(auVar163,0x4e);
            auVar163 = vminps_avx(auVar163,auVar161);
            auVar121 = vcmpps_avx(auVar121,auVar163,0);
            auVar163 = auVar198 & auVar121;
            if ((((((((auVar163 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar163 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar163 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar163 >> 0x7f,0) != '\0') ||
                  (auVar163 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar163 >> 0xbf,0) != '\0') ||
                (auVar163 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar163[0x1f] < '\0') {
              auVar198 = vandps_avx(auVar121,auVar198);
            }
            uVar99 = vmovmskps_avx(auVar198);
            uVar101 = 0;
            for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
              uVar101 = uVar101 + 1;
            }
            uVar108 = (ulong)uVar101;
            local_3e0 = auVar20;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar106->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_7e0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
              local_7a0._0_8_ = pGVar106;
              _local_320 = auVar160;
              do {
                local_644 = local_200[uVar108];
                local_640 = *(undefined4 *)((long)&local_1e0 + uVar108 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar108 * 4);
                local_710.context = context->user;
                fVar147 = 1.0 - local_644;
                auVar173 = ZEXT416((uint)(local_644 * fVar147 * 4.0));
                auVar8 = vfnmsub213ss_fma(ZEXT416((uint)local_644),ZEXT416((uint)local_644),auVar173
                                         );
                auVar173 = vfmadd213ss_fma(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),auVar173);
                fVar147 = fVar147 * -fVar147 * 0.5;
                fVar141 = auVar8._0_4_ * 0.5;
                fVar142 = auVar173._0_4_ * 0.5;
                fVar143 = local_644 * local_644 * 0.5;
                auVar176._0_4_ = fVar143 * (float)local_760._0_4_;
                auVar176._4_4_ = fVar143 * (float)local_760._4_4_;
                auVar176._8_4_ = fVar143 * (float)uStack_758;
                auVar176._12_4_ = fVar143 * uStack_758._4_4_;
                auVar154._4_4_ = fVar142;
                auVar154._0_4_ = fVar142;
                auVar154._8_4_ = fVar142;
                auVar154._12_4_ = fVar142;
                auVar173 = vfmadd132ps_fma(auVar154,auVar176,local_750);
                auVar177._4_4_ = fVar141;
                auVar177._0_4_ = fVar141;
                auVar177._8_4_ = fVar141;
                auVar177._12_4_ = fVar141;
                auVar173 = vfmadd132ps_fma(auVar177,auVar173,local_740);
                auVar155._4_4_ = fVar147;
                auVar155._0_4_ = fVar147;
                auVar155._8_4_ = fVar147;
                auVar155._12_4_ = fVar147;
                auVar173 = vfmadd132ps_fma(auVar155,auVar173,local_730);
                local_650 = vmovlps_avx(auVar173);
                local_648 = vextractps_avx(auVar173,2);
                local_63c = (int)local_7a8;
                local_638 = (int)local_7e8;
                local_634 = (local_710.context)->instID[0];
                local_630 = (local_710.context)->instPrimID[0];
                local_7f4 = -1;
                local_710.valid = &local_7f4;
                local_710.geometryUserPtr = pGVar106->userPtr;
                local_710.ray = (RTCRayN *)ray;
                local_710.hit = (RTCHitN *)&local_650;
                local_710.N = 1;
                if (pGVar106->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_014048af:
                  p_Var19 = context->args->filter;
                  if ((p_Var19 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((pGVar106->field_8).field_0x2 & 0x40) != 0)))) {
                    auVar229 = ZEXT1664(auVar229._0_16_);
                    auVar232 = ZEXT1664(auVar232._0_16_);
                    (*p_Var19)(&local_710);
                    ray = local_7f0;
                    pGVar106 = (Geometry *)local_7a0._0_8_;
                    if (*local_710.valid == 0) goto LAB_0140494b;
                  }
                  (((Vec3f *)((long)local_710.ray + 0x30))->field_0).components[0] =
                       *(float *)local_710.hit;
                  (((Vec3f *)((long)local_710.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_710.hit + 4);
                  (((Vec3f *)((long)local_710.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_710.hit + 8);
                  *(float *)((long)local_710.ray + 0x3c) = *(float *)(local_710.hit + 0xc);
                  *(float *)((long)local_710.ray + 0x40) = *(float *)(local_710.hit + 0x10);
                  *(float *)((long)local_710.ray + 0x44) = *(float *)(local_710.hit + 0x14);
                  *(float *)((long)local_710.ray + 0x48) = *(float *)(local_710.hit + 0x18);
                  *(float *)((long)local_710.ray + 0x4c) = *(float *)(local_710.hit + 0x1c);
                  *(float *)((long)local_710.ray + 0x50) = *(float *)(local_710.hit + 0x20);
                }
                else {
                  auVar229 = ZEXT1664(auVar229._0_16_);
                  auVar232 = ZEXT1664(auVar232._0_16_);
                  (*pGVar106->intersectionFilterN)(&local_710);
                  ray = local_7f0;
                  pGVar106 = (Geometry *)local_7a0._0_8_;
                  if (*local_710.valid != 0) goto LAB_014048af;
LAB_0140494b:
                  (local_7f0->super_RayK<1>).tfar = (float)local_7e0._0_4_;
                  ray = local_7f0;
                  pGVar106 = (Geometry *)local_7a0._0_8_;
                }
                *(undefined4 *)(local_520[0] + uVar108 * 4) = 0;
                auVar121 = local_520[0];
                fVar147 = (ray->super_RayK<1>).tfar;
                auVar122._4_4_ = fVar147;
                auVar122._0_4_ = fVar147;
                auVar122._8_4_ = fVar147;
                auVar122._12_4_ = fVar147;
                auVar122._16_4_ = fVar147;
                auVar122._20_4_ = fVar147;
                auVar122._24_4_ = fVar147;
                auVar122._28_4_ = fVar147;
                auVar20 = vcmpps_avx(local_3c0,auVar122,2);
                auVar198 = vandps_avx(auVar20,local_520[0]);
                local_520[0] = auVar198;
                auVar121 = auVar121 & auVar20;
                if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar121 >> 0x7f,0) == '\0') &&
                      (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar121 >> 0xbf,0) == '\0') &&
                    (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar121[0x1f]) goto LAB_014049e4;
                auVar138._8_4_ = 0x7f800000;
                auVar138._0_8_ = 0x7f8000007f800000;
                auVar138._12_4_ = 0x7f800000;
                auVar138._16_4_ = 0x7f800000;
                auVar138._20_4_ = 0x7f800000;
                auVar138._24_4_ = 0x7f800000;
                auVar138._28_4_ = 0x7f800000;
                auVar20 = vblendvps_avx(auVar138,local_3c0,auVar198);
                auVar121 = vshufps_avx(auVar20,auVar20,0xb1);
                auVar121 = vminps_avx(auVar20,auVar121);
                auVar163 = vshufpd_avx(auVar121,auVar121,5);
                auVar121 = vminps_avx(auVar121,auVar163);
                auVar163 = vpermpd_avx2(auVar121,0x4e);
                auVar121 = vminps_avx(auVar121,auVar163);
                auVar20 = vcmpps_avx(auVar20,auVar121,0);
                auVar121 = auVar198 & auVar20;
                if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar121 >> 0x7f,0) != '\0') ||
                      (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar121 >> 0xbf,0) != '\0') ||
                    (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar121[0x1f] < '\0') {
                  auVar198 = vandps_avx(auVar20,auVar198);
                }
                local_7e0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                uVar99 = vmovmskps_avx(auVar198);
                uVar101 = 0;
                for (; (uVar99 & 1) == 0; uVar99 = uVar99 >> 1 | 0x80000000) {
                  uVar101 = uVar101 + 1;
                }
                uVar108 = (ulong)uVar101;
              } while( true );
            }
            fVar147 = local_200[uVar108];
            fVar141 = *(float *)((long)&local_1e0 + uVar108 * 4);
            fVar142 = 1.0 - fVar147;
            auVar173 = ZEXT416((uint)(fVar147 * fVar142 * 4.0));
            auVar8 = vfnmsub213ss_fma(ZEXT416((uint)fVar147),ZEXT416((uint)fVar147),auVar173);
            auVar173 = vfmadd213ss_fma(ZEXT416((uint)fVar142),ZEXT416((uint)fVar142),auVar173);
            fVar142 = fVar142 * -fVar142 * 0.5;
            fVar143 = auVar8._0_4_ * 0.5;
            fVar144 = auVar173._0_4_ * 0.5;
            fVar145 = fVar147 * fVar147 * 0.5;
            auVar174._0_4_ = fVar145 * (float)local_760._0_4_;
            auVar174._4_4_ = fVar145 * (float)local_760._4_4_;
            auVar174._8_4_ = fVar145 * (float)uStack_758;
            auVar174._12_4_ = fVar145 * uStack_758._4_4_;
            auVar152._4_4_ = fVar144;
            auVar152._0_4_ = fVar144;
            auVar152._8_4_ = fVar144;
            auVar152._12_4_ = fVar144;
            auVar173 = vfmadd132ps_fma(auVar152,auVar174,local_750);
            auVar175._4_4_ = fVar143;
            auVar175._0_4_ = fVar143;
            auVar175._8_4_ = fVar143;
            auVar175._12_4_ = fVar143;
            auVar173 = vfmadd132ps_fma(auVar175,auVar173,local_740);
            auVar153._4_4_ = fVar142;
            auVar153._0_4_ = fVar142;
            auVar153._8_4_ = fVar142;
            auVar153._12_4_ = fVar142;
            auVar173 = vfmadd132ps_fma(auVar153,auVar173,local_730);
            (ray->super_RayK<1>).tfar = *(float *)(local_1c0 + uVar108 * 4);
            uVar109 = vmovlps_avx(auVar173);
            *(undefined8 *)&(ray->Ng).field_0 = uVar109;
            fVar142 = (float)vextractps_avx(auVar173,2);
            (ray->Ng).field_0.field_0.z = fVar142;
            ray->u = fVar147;
            ray->v = fVar141;
            ray->primID = (uint)local_7a8;
            ray->geomID = (uint)local_7e8;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            goto LAB_014046a1;
          }
          auVar140 = ZEXT3264(local_5e0);
          goto LAB_014046c5;
        }
        auVar140 = ZEXT3264(auVar140._0_32_);
        auVar239 = ZEXT3264(auVar115);
        auVar218 = ZEXT3264(auVar215);
        auVar220 = ZEXT3264(local_780);
        goto LAB_014046d7;
      }
    }
    fVar147 = (ray->super_RayK<1>).tfar;
    auVar119._4_4_ = fVar147;
    auVar119._0_4_ = fVar147;
    auVar119._8_4_ = fVar147;
    auVar119._12_4_ = fVar147;
    auVar119._16_4_ = fVar147;
    auVar119._20_4_ = fVar147;
    auVar119._24_4_ = fVar147;
    auVar119._28_4_ = fVar147;
    auVar198 = vcmpps_avx(local_80,auVar119,2);
    uVar101 = vmovmskps_avx(auVar198);
    uVar100 = (ulong)((uint)uVar100 & (uint)uVar100 + 0xff & uVar101);
  } while( true );
LAB_014049e4:
  auVar239 = ZEXT3264(local_6e0);
  auVar218 = ZEXT3264(local_6c0);
  auVar220 = ZEXT3264(local_780);
LAB_014046a1:
  auVar140 = ZEXT3264(local_5e0);
  prim = local_720;
  lVar105 = local_7b0;
LAB_014046c5:
  fVar147 = (float)local_5a0;
  fVar141 = local_5a0._4_4_;
  fVar142 = (float)uStack_598;
  fVar143 = uStack_598._4_4_;
  fVar144 = (float)uStack_590;
  fVar145 = uStack_590._4_4_;
  fVar146 = (float)uStack_588;
  uVar107 = uStack_588._4_4_;
LAB_014046d7:
  lVar103 = lVar103 + 8;
  auVar169 = ZEXT3264(local_540);
  goto LAB_01403be5;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }